

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O1

void __thiscall cnn::AdadeltaTrainer::update(AdadeltaTrainer *this,real scale)

{
  real rVar1;
  float fVar2;
  Model *pMVar3;
  Parameters *pPVar4;
  pointer pSVar5;
  float *pfVar6;
  float *pfVar7;
  pointer pSVar8;
  pointer pTVar9;
  pointer pTVar10;
  long lVar11;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
  eVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  undefined8 uVar17;
  byte bVar18;
  byte bVar19;
  Parameters *this_00;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong *puVar23;
  char *__function;
  Index index_3;
  ulong uVar24;
  Index dstRows_1;
  ulong uVar25;
  LookupParameters *pLVar26;
  AdadeltaTrainer *pAVar27;
  ulong uVar28;
  uint uVar29;
  Index size;
  Index size_1;
  Index index;
  ulong uVar30;
  Index index_1;
  ulong uVar31;
  uint uVar32;
  Index dstRows_2;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
  eVar33;
  uint uVar34;
  Index dstRows;
  LookupParameters *pLVar35;
  ulong uVar36;
  ushort uVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  int iVar76;
  int iVar77;
  int iVar78;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  assign_op<float,_float> local_279;
  float local_278;
  real local_274;
  LookupParameters *local_270;
  float local_264;
  ulong local_260;
  generic_dense_assignment_kernel<_ad2e0912_> local_258;
  Parameters *local_238;
  ulong local_230;
  ulong *local_228;
  AdadeltaTrainer *local_220;
  ulong local_218;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
  local_210;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
  local_208;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
  local_200;
  pointer local_1f8;
  float *local_1f0;
  ulong local_1e8;
  float *local_1d8 [2];
  ulong local_1c8;
  ulong *local_1c0;
  undefined1 local_1b8 [12];
  float fStack_1ac;
  pointer local_1a8;
  LookupParameters *local_1a0;
  float local_194;
  variable_if_dynamic<long,__1> local_190;
  undefined8 local_188;
  ulong local_178;
  LookupParameters *local_160;
  scalar_constant_op<float> local_154;
  ulong local_150;
  float *local_148;
  variable_if_dynamic<long,__1> local_138;
  float *local_130;
  LookupParameters *local_120;
  real local_118;
  variable_if_dynamic<long,__1> local_110;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
  local_108;
  ulong local_f8;
  float *local_f0;
  variable_if_dynamic<long,__1> local_e0;
  scalar_constant_op<float> local_d8;
  scalar_constant_op<float> local_b4;
  float *local_a8;
  variable_if_dynamic<long,__1> local_98;
  LookupParameters *local_80;
  variable_if_dynamic<long,__1> local_70;
  scalar_constant_op<float> local_68;
  float *local_50;
  variable_if_dynamic<long,__1> local_40;
  scalar_constant_op<float> local_38;
  
  local_260 = CONCAT44(local_260._4_4_,scale);
  if (this->shadow_params_allocated == false) {
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_258,
               (this->super_Trainer).model);
    local_1b8._0_8_ =
         (this->hg).
         super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>._M_impl.
         super__Vector_impl_data._M_start;
    unique0x10000faf =
         (this->hg).
         super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_1a8 = &((this->hg).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage)->h;
    (this->hg).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_258.m_dst;
    (this->hg).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_258.m_src;
    (this->hg).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_258.m_functor;
    local_258.m_dst = (DstEvaluatorType *)0x0;
    local_258.m_src = (SrcEvaluatorType *)0x0;
    local_258.m_functor = (assign_op<float,_float> *)0x0;
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)local_1b8);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_258);
    AllocateShadowLookupParameters
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_258,(this->super_Trainer).model);
    local_1b8._0_8_ =
         (this->hlg).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    unique0x1000100f =
         (pointer)(this->hlg).
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_1a8 = (pointer)(this->hlg).
                         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->hlg).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_258.m_dst;
    (this->hlg).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_258.m_src;
    (this->hlg).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_258.m_functor;
    local_258.m_dst = (DstEvaluatorType *)0x0;
    local_258.m_src = (SrcEvaluatorType *)0x0;
    local_258.m_functor = (assign_op<float,_float> *)0x0;
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               local_1b8);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_258);
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_258,
               (this->super_Trainer).model);
    local_1b8._0_8_ =
         (this->hd).
         super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>._M_impl.
         super__Vector_impl_data._M_start;
    unique0x1000106f =
         (this->hd).
         super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_1a8 = &((this->hd).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage)->h;
    (this->hd).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_258.m_dst;
    (this->hd).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_258.m_src;
    (this->hd).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_258.m_functor;
    local_258.m_dst = (DstEvaluatorType *)0x0;
    local_258.m_src = (SrcEvaluatorType *)0x0;
    local_258.m_functor = (assign_op<float,_float> *)0x0;
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)local_1b8);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_258);
    AllocateShadowLookupParameters
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_258,(this->super_Trainer).model);
    local_1b8._0_8_ =
         (this->hld).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    unique0x100010cf =
         (pointer)(this->hld).
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_1a8 = (pointer)(this->hld).
                         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->hld).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_258.m_dst;
    (this->hld).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_258.m_src;
    (this->hld).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_258.m_functor;
    local_258.m_dst = (DstEvaluatorType *)0x0;
    local_258.m_src = (SrcEvaluatorType *)0x0;
    local_258.m_functor = (assign_op<float,_float> *)0x0;
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               local_1b8);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_258);
    this->shadow_params_allocated = true;
  }
  local_278 = Trainer::clip_gradients(&this->super_Trainer);
  local_228 = (ulong *)CONCAT44(local_228._4_4_,local_278);
  pMVar3 = (this->super_Trainer).model;
  eVar33 = *(evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
             *)(pMVar3 + 0x18);
  local_200 = *(evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                *)(pMVar3 + 0x20);
  local_220 = this;
  if (eVar33 != local_200) {
    local_278 = local_278 * (float)local_260;
    local_264 = local_278 * local_278;
    uVar20 = 0;
    auVar39 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar40 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      pPVar4 = *(Parameters **)eVar33;
      uVar22 = (ulong)(pPVar4->g).d.nd;
      iVar77 = 1;
      iVar76 = 1;
      if (uVar22 != 0) {
        auVar42 = vpbroadcastq_avx512f();
        uVar24 = 0;
        auVar43 = vmovdqa64_avx512f(auVar39);
        do {
          auVar44 = vmovdqa64_avx512f(auVar43);
          auVar43 = vpbroadcastq_avx512f();
          auVar45 = vporq_avx512f(auVar43,auVar40);
          auVar43 = vporq_avx512f(auVar43,auVar41);
          uVar17 = vpcmpuq_avx512f(auVar43,auVar42,2);
          bVar18 = (byte)uVar17;
          uVar17 = vpcmpuq_avx512f(auVar45,auVar42,2);
          bVar19 = (byte)uVar17;
          uVar37 = CONCAT11(bVar19,bVar18);
          auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pPVar4->g).d.d + uVar24));
          auVar45._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar43._4_4_;
          auVar45._0_4_ = (uint)(bVar18 & 1) * auVar43._0_4_;
          auVar45._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar43._8_4_;
          auVar45._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar43._12_4_;
          auVar45._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar43._16_4_;
          auVar45._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar43._20_4_;
          auVar45._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar43._24_4_;
          auVar45._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar43._28_4_;
          auVar45._32_4_ = (uint)(bVar19 & 1) * auVar43._32_4_;
          auVar45._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar43._36_4_;
          auVar45._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar43._40_4_;
          auVar45._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar43._44_4_;
          auVar45._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar43._48_4_;
          auVar45._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar43._52_4_;
          auVar45._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar43._56_4_;
          auVar45._60_4_ = (uint)(bVar19 >> 7) * auVar43._60_4_;
          auVar43 = vpmulld_avx512f(auVar45,auVar44);
          uVar24 = uVar24 + 0x10;
        } while ((uVar22 + 0xf & 0x1fffffff0) != uVar24);
        auVar42 = vmovdqa32_avx512f(auVar43);
        auVar43._0_4_ =
             (uint)(bVar18 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar44._0_4_;
        bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
        auVar43._4_4_ = (uint)bVar13 * auVar42._4_4_ | (uint)!bVar13 * auVar44._4_4_;
        bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
        auVar43._8_4_ = (uint)bVar13 * auVar42._8_4_ | (uint)!bVar13 * auVar44._8_4_;
        bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
        auVar43._12_4_ = (uint)bVar13 * auVar42._12_4_ | (uint)!bVar13 * auVar44._12_4_;
        bVar13 = (bool)((byte)(uVar37 >> 4) & 1);
        auVar43._16_4_ = (uint)bVar13 * auVar42._16_4_ | (uint)!bVar13 * auVar44._16_4_;
        bVar13 = (bool)((byte)(uVar37 >> 5) & 1);
        auVar43._20_4_ = (uint)bVar13 * auVar42._20_4_ | (uint)!bVar13 * auVar44._20_4_;
        bVar13 = (bool)((byte)(uVar37 >> 6) & 1);
        auVar43._24_4_ = (uint)bVar13 * auVar42._24_4_ | (uint)!bVar13 * auVar44._24_4_;
        bVar13 = (bool)((byte)(uVar37 >> 7) & 1);
        auVar43._28_4_ = (uint)bVar13 * auVar42._28_4_ | (uint)!bVar13 * auVar44._28_4_;
        auVar43._32_4_ =
             (uint)(bVar19 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar44._32_4_;
        bVar13 = (bool)(bVar19 >> 1 & 1);
        auVar43._36_4_ = (uint)bVar13 * auVar42._36_4_ | (uint)!bVar13 * auVar44._36_4_;
        bVar13 = (bool)(bVar19 >> 2 & 1);
        auVar43._40_4_ = (uint)bVar13 * auVar42._40_4_ | (uint)!bVar13 * auVar44._40_4_;
        bVar13 = (bool)(bVar19 >> 3 & 1);
        auVar43._44_4_ = (uint)bVar13 * auVar42._44_4_ | (uint)!bVar13 * auVar44._44_4_;
        bVar13 = (bool)(bVar19 >> 4 & 1);
        auVar43._48_4_ = (uint)bVar13 * auVar42._48_4_ | (uint)!bVar13 * auVar44._48_4_;
        bVar13 = (bool)(bVar19 >> 5 & 1);
        auVar43._52_4_ = (uint)bVar13 * auVar42._52_4_ | (uint)!bVar13 * auVar44._52_4_;
        bVar13 = (bool)(bVar19 >> 6 & 1);
        auVar43._56_4_ = (uint)bVar13 * auVar42._56_4_ | (uint)!bVar13 * auVar44._56_4_;
        auVar43._60_4_ =
             (uint)(bVar19 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar44._60_4_;
        auVar38 = vextracti64x4_avx512f(auVar43,1);
        auVar42 = vpmulld_avx512f(auVar43,ZEXT3264(auVar38));
        auVar14 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
        auVar15 = vpshufd_avx(auVar14,0xee);
        auVar14 = vpmulld_avx(auVar14,auVar15);
        auVar15 = vpshufd_avx(auVar14,0x55);
        auVar14 = vpmulld_avx(auVar14,auVar15);
        iVar76 = auVar14._0_4_;
      }
      uVar22 = (ulong)(pPVar4->values).d.nd;
      if (uVar22 != 0) {
        auVar42 = vpbroadcastq_avx512f();
        uVar24 = 0;
        auVar43 = vmovdqa64_avx512f(auVar39);
        do {
          auVar44 = vmovdqa64_avx512f(auVar43);
          auVar43 = vpbroadcastq_avx512f();
          auVar45 = vporq_avx512f(auVar43,auVar40);
          auVar43 = vporq_avx512f(auVar43,auVar41);
          uVar17 = vpcmpuq_avx512f(auVar43,auVar42,2);
          bVar18 = (byte)uVar17;
          uVar17 = vpcmpuq_avx512f(auVar45,auVar42,2);
          bVar19 = (byte)uVar17;
          uVar37 = CONCAT11(bVar19,bVar18);
          auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)&(((_Vector_impl *)(pPVar4->values).d.d)->
                                               super__Vector_impl_data)._M_start + uVar24 * 4));
          auVar46._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar43._4_4_;
          auVar46._0_4_ = (uint)(bVar18 & 1) * auVar43._0_4_;
          auVar46._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar43._8_4_;
          auVar46._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar43._12_4_;
          auVar46._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar43._16_4_;
          auVar46._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar43._20_4_;
          auVar46._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar43._24_4_;
          auVar46._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar43._28_4_;
          auVar46._32_4_ = (uint)(bVar19 & 1) * auVar43._32_4_;
          auVar46._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar43._36_4_;
          auVar46._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar43._40_4_;
          auVar46._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar43._44_4_;
          auVar46._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar43._48_4_;
          auVar46._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar43._52_4_;
          auVar46._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar43._56_4_;
          auVar46._60_4_ = (uint)(bVar19 >> 7) * auVar43._60_4_;
          auVar43 = vpmulld_avx512f(auVar46,auVar44);
          uVar24 = uVar24 + 0x10;
        } while ((uVar22 + 0xf & 0x1fffffff0) != uVar24);
        auVar42 = vmovdqa32_avx512f(auVar43);
        auVar47._0_4_ =
             (uint)(bVar18 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar44._0_4_;
        bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
        auVar47._4_4_ = (uint)bVar13 * auVar42._4_4_ | (uint)!bVar13 * auVar44._4_4_;
        bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
        auVar47._8_4_ = (uint)bVar13 * auVar42._8_4_ | (uint)!bVar13 * auVar44._8_4_;
        bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
        auVar47._12_4_ = (uint)bVar13 * auVar42._12_4_ | (uint)!bVar13 * auVar44._12_4_;
        bVar13 = (bool)((byte)(uVar37 >> 4) & 1);
        auVar47._16_4_ = (uint)bVar13 * auVar42._16_4_ | (uint)!bVar13 * auVar44._16_4_;
        bVar13 = (bool)((byte)(uVar37 >> 5) & 1);
        auVar47._20_4_ = (uint)bVar13 * auVar42._20_4_ | (uint)!bVar13 * auVar44._20_4_;
        bVar13 = (bool)((byte)(uVar37 >> 6) & 1);
        auVar47._24_4_ = (uint)bVar13 * auVar42._24_4_ | (uint)!bVar13 * auVar44._24_4_;
        bVar13 = (bool)((byte)(uVar37 >> 7) & 1);
        auVar47._28_4_ = (uint)bVar13 * auVar42._28_4_ | (uint)!bVar13 * auVar44._28_4_;
        auVar47._32_4_ =
             (uint)(bVar19 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar44._32_4_;
        bVar13 = (bool)(bVar19 >> 1 & 1);
        auVar47._36_4_ = (uint)bVar13 * auVar42._36_4_ | (uint)!bVar13 * auVar44._36_4_;
        bVar13 = (bool)(bVar19 >> 2 & 1);
        auVar47._40_4_ = (uint)bVar13 * auVar42._40_4_ | (uint)!bVar13 * auVar44._40_4_;
        bVar13 = (bool)(bVar19 >> 3 & 1);
        auVar47._44_4_ = (uint)bVar13 * auVar42._44_4_ | (uint)!bVar13 * auVar44._44_4_;
        bVar13 = (bool)(bVar19 >> 4 & 1);
        auVar47._48_4_ = (uint)bVar13 * auVar42._48_4_ | (uint)!bVar13 * auVar44._48_4_;
        bVar13 = (bool)(bVar19 >> 5 & 1);
        auVar47._52_4_ = (uint)bVar13 * auVar42._52_4_ | (uint)!bVar13 * auVar44._52_4_;
        bVar13 = (bool)(bVar19 >> 6 & 1);
        auVar47._56_4_ = (uint)bVar13 * auVar42._56_4_ | (uint)!bVar13 * auVar44._56_4_;
        auVar47._60_4_ =
             (uint)(bVar19 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar44._60_4_;
        auVar38 = vextracti64x4_avx512f(auVar47,1);
        auVar42 = vpmulld_avx512f(auVar47,ZEXT3264(auVar38));
        auVar14 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
        auVar15 = vpshufd_avx(auVar14,0xee);
        auVar14 = vpmulld_avx(auVar14,auVar15);
        auVar15 = vpshufd_avx(auVar14,0x55);
        auVar14 = vpmulld_avx(auVar14,auVar15);
        iVar77 = auVar14._0_4_;
      }
      pSVar5 = (local_220->hg).
               super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar22 = (ulong)pSVar5[uVar20].h.d.nd;
      if (uVar22 == 0) {
        iVar78 = 1;
      }
      else {
        auVar42 = vpbroadcastq_avx512f();
        uVar24 = 0;
        auVar43 = vmovdqa64_avx512f(auVar39);
        do {
          auVar44 = vmovdqa64_avx512f(auVar43);
          auVar43 = vpbroadcastq_avx512f();
          auVar45 = vporq_avx512f(auVar43,auVar40);
          auVar43 = vporq_avx512f(auVar43,auVar41);
          uVar17 = vpcmpuq_avx512f(auVar43,auVar42,2);
          bVar18 = (byte)uVar17;
          uVar17 = vpcmpuq_avx512f(auVar45,auVar42,2);
          bVar19 = (byte)uVar17;
          uVar37 = CONCAT11(bVar19,bVar18);
          auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar5[uVar20].h.d.d + uVar24 * 4));
          auVar48._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar43._4_4_;
          auVar48._0_4_ = (uint)(bVar18 & 1) * auVar43._0_4_;
          auVar48._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar43._8_4_;
          auVar48._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar43._12_4_;
          auVar48._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar43._16_4_;
          auVar48._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar43._20_4_;
          auVar48._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar43._24_4_;
          auVar48._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar43._28_4_;
          auVar48._32_4_ = (uint)(bVar19 & 1) * auVar43._32_4_;
          auVar48._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar43._36_4_;
          auVar48._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar43._40_4_;
          auVar48._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar43._44_4_;
          auVar48._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar43._48_4_;
          auVar48._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar43._52_4_;
          auVar48._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar43._56_4_;
          auVar48._60_4_ = (uint)(bVar19 >> 7) * auVar43._60_4_;
          auVar43 = vpmulld_avx512f(auVar48,auVar44);
          uVar24 = uVar24 + 0x10;
        } while ((uVar22 + 0xf & 0x1fffffff0) != uVar24);
        auVar42 = vmovdqa32_avx512f(auVar43);
        auVar49._0_4_ =
             (uint)(bVar18 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar44._0_4_;
        bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
        auVar49._4_4_ = (uint)bVar13 * auVar42._4_4_ | (uint)!bVar13 * auVar44._4_4_;
        bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
        auVar49._8_4_ = (uint)bVar13 * auVar42._8_4_ | (uint)!bVar13 * auVar44._8_4_;
        bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
        auVar49._12_4_ = (uint)bVar13 * auVar42._12_4_ | (uint)!bVar13 * auVar44._12_4_;
        bVar13 = (bool)((byte)(uVar37 >> 4) & 1);
        auVar49._16_4_ = (uint)bVar13 * auVar42._16_4_ | (uint)!bVar13 * auVar44._16_4_;
        bVar13 = (bool)((byte)(uVar37 >> 5) & 1);
        auVar49._20_4_ = (uint)bVar13 * auVar42._20_4_ | (uint)!bVar13 * auVar44._20_4_;
        bVar13 = (bool)((byte)(uVar37 >> 6) & 1);
        auVar49._24_4_ = (uint)bVar13 * auVar42._24_4_ | (uint)!bVar13 * auVar44._24_4_;
        bVar13 = (bool)((byte)(uVar37 >> 7) & 1);
        auVar49._28_4_ = (uint)bVar13 * auVar42._28_4_ | (uint)!bVar13 * auVar44._28_4_;
        auVar49._32_4_ =
             (uint)(bVar19 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar44._32_4_;
        bVar13 = (bool)(bVar19 >> 1 & 1);
        auVar49._36_4_ = (uint)bVar13 * auVar42._36_4_ | (uint)!bVar13 * auVar44._36_4_;
        bVar13 = (bool)(bVar19 >> 2 & 1);
        auVar49._40_4_ = (uint)bVar13 * auVar42._40_4_ | (uint)!bVar13 * auVar44._40_4_;
        bVar13 = (bool)(bVar19 >> 3 & 1);
        auVar49._44_4_ = (uint)bVar13 * auVar42._44_4_ | (uint)!bVar13 * auVar44._44_4_;
        bVar13 = (bool)(bVar19 >> 4 & 1);
        auVar49._48_4_ = (uint)bVar13 * auVar42._48_4_ | (uint)!bVar13 * auVar44._48_4_;
        bVar13 = (bool)(bVar19 >> 5 & 1);
        auVar49._52_4_ = (uint)bVar13 * auVar42._52_4_ | (uint)!bVar13 * auVar44._52_4_;
        bVar13 = (bool)(bVar19 >> 6 & 1);
        auVar49._56_4_ = (uint)bVar13 * auVar42._56_4_ | (uint)!bVar13 * auVar44._56_4_;
        auVar49._60_4_ =
             (uint)(bVar19 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar44._60_4_;
        auVar38 = vextracti64x4_avx512f(auVar49,1);
        auVar42 = vpmulld_avx512f(auVar49,ZEXT3264(auVar38));
        auVar14 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
        auVar15 = vpshufd_avx(auVar14,0xee);
        auVar14 = vpmulld_avx(auVar14,auVar15);
        auVar15 = vpshufd_avx(auVar14,0x55);
        auVar14 = vpmulld_avx(auVar14,auVar15);
        iVar78 = auVar14._0_4_;
      }
      uVar34 = iVar76 * (pPVar4->g).d.bd;
      uVar24 = (ulong)uVar34;
      uVar29 = pSVar5[uVar20].h.d.bd;
      if (iVar78 * uVar29 != uVar34) goto LAB_00255e2c;
      if (uVar22 == 0) {
        iVar76 = 1;
      }
      else {
        auVar42 = vpbroadcastq_avx512f();
        uVar30 = 0;
        auVar43 = vmovdqa64_avx512f(auVar39);
        do {
          auVar44 = vmovdqa64_avx512f(auVar43);
          auVar43 = vpbroadcastq_avx512f();
          auVar45 = vporq_avx512f(auVar43,auVar40);
          auVar43 = vporq_avx512f(auVar43,auVar41);
          uVar17 = vpcmpuq_avx512f(auVar43,auVar42,2);
          bVar18 = (byte)uVar17;
          uVar17 = vpcmpuq_avx512f(auVar45,auVar42,2);
          bVar19 = (byte)uVar17;
          uVar37 = CONCAT11(bVar19,bVar18);
          auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar5[uVar20].h.d.d + uVar30 * 4));
          auVar50._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar43._4_4_;
          auVar50._0_4_ = (uint)(bVar18 & 1) * auVar43._0_4_;
          auVar50._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar43._8_4_;
          auVar50._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar43._12_4_;
          auVar50._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar43._16_4_;
          auVar50._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar43._20_4_;
          auVar50._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar43._24_4_;
          auVar50._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar43._28_4_;
          auVar50._32_4_ = (uint)(bVar19 & 1) * auVar43._32_4_;
          auVar50._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar43._36_4_;
          auVar50._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar43._40_4_;
          auVar50._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar43._44_4_;
          auVar50._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar43._48_4_;
          auVar50._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar43._52_4_;
          auVar50._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar43._56_4_;
          auVar50._60_4_ = (uint)(bVar19 >> 7) * auVar43._60_4_;
          auVar43 = vpmulld_avx512f(auVar50,auVar44);
          uVar30 = uVar30 + 0x10;
        } while ((uVar22 + 0xf & 0x1fffffff0) != uVar30);
        auVar42 = vmovdqa32_avx512f(auVar43);
        auVar51._0_4_ =
             (uint)(bVar18 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar44._0_4_;
        bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
        auVar51._4_4_ = (uint)bVar13 * auVar42._4_4_ | (uint)!bVar13 * auVar44._4_4_;
        bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
        auVar51._8_4_ = (uint)bVar13 * auVar42._8_4_ | (uint)!bVar13 * auVar44._8_4_;
        bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
        auVar51._12_4_ = (uint)bVar13 * auVar42._12_4_ | (uint)!bVar13 * auVar44._12_4_;
        bVar13 = (bool)((byte)(uVar37 >> 4) & 1);
        auVar51._16_4_ = (uint)bVar13 * auVar42._16_4_ | (uint)!bVar13 * auVar44._16_4_;
        bVar13 = (bool)((byte)(uVar37 >> 5) & 1);
        auVar51._20_4_ = (uint)bVar13 * auVar42._20_4_ | (uint)!bVar13 * auVar44._20_4_;
        bVar13 = (bool)((byte)(uVar37 >> 6) & 1);
        auVar51._24_4_ = (uint)bVar13 * auVar42._24_4_ | (uint)!bVar13 * auVar44._24_4_;
        bVar13 = (bool)((byte)(uVar37 >> 7) & 1);
        auVar51._28_4_ = (uint)bVar13 * auVar42._28_4_ | (uint)!bVar13 * auVar44._28_4_;
        auVar51._32_4_ =
             (uint)(bVar19 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar44._32_4_;
        bVar13 = (bool)(bVar19 >> 1 & 1);
        auVar51._36_4_ = (uint)bVar13 * auVar42._36_4_ | (uint)!bVar13 * auVar44._36_4_;
        bVar13 = (bool)(bVar19 >> 2 & 1);
        auVar51._40_4_ = (uint)bVar13 * auVar42._40_4_ | (uint)!bVar13 * auVar44._40_4_;
        bVar13 = (bool)(bVar19 >> 3 & 1);
        auVar51._44_4_ = (uint)bVar13 * auVar42._44_4_ | (uint)!bVar13 * auVar44._44_4_;
        bVar13 = (bool)(bVar19 >> 4 & 1);
        auVar51._48_4_ = (uint)bVar13 * auVar42._48_4_ | (uint)!bVar13 * auVar44._48_4_;
        bVar13 = (bool)(bVar19 >> 5 & 1);
        auVar51._52_4_ = (uint)bVar13 * auVar42._52_4_ | (uint)!bVar13 * auVar44._52_4_;
        bVar13 = (bool)(bVar19 >> 6 & 1);
        auVar51._56_4_ = (uint)bVar13 * auVar42._56_4_ | (uint)!bVar13 * auVar44._56_4_;
        auVar51._60_4_ =
             (uint)(bVar19 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar44._60_4_;
        auVar38 = vextracti64x4_avx512f(auVar51,1);
        auVar42 = vpmulld_avx512f(auVar51,ZEXT3264(auVar38));
        auVar14 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
        auVar15 = vpshufd_avx(auVar14,0xee);
        auVar14 = vpmulld_avx(auVar14,auVar15);
        auVar15 = vpshufd_avx(auVar14,0x55);
        auVar14 = vpmulld_avx(auVar14,auVar15);
        iVar76 = auVar14._0_4_;
      }
      uVar29 = iVar76 * uVar29;
      uVar22 = (ulong)uVar29;
      local_208 = eVar33;
      if (uVar29 != uVar34) {
LAB_00255dba:
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                     );
      }
      pfVar6 = pSVar5[uVar20].h.v;
      uVar30 = uVar22;
      if ((((ulong)pfVar6 & 3) == 0) &&
         (uVar30 = (ulong)(-((uint)((ulong)pfVar6 >> 2) & 0x3fffffff) & 0xf), uVar22 <= uVar30)) {
        uVar30 = uVar22;
      }
      pfVar7 = (pPVar4->g).v;
      pSVar8 = (local_220->hd).
               super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_210 = (evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                   )(pPVar4->values).v;
      local_230 = (ulong)(iVar77 * (pPVar4->values).d.bd);
      rVar1 = (local_220->super_Trainer).lambda;
      fVar2 = local_220->rho;
      fVar16 = 1.0 - fVar2;
      uVar25 = uVar22 - uVar30;
      uVar31 = uVar25 + 0xf;
      if (-1 < (long)uVar25) {
        uVar31 = uVar25;
      }
      if (uVar30 != 0) {
        uVar36 = 0;
        do {
          auVar14 = vfmadd213ss_fma(ZEXT416((uint)(local_278 * pfVar7[uVar36] *
                                                  local_278 * pfVar7[uVar36])),ZEXT416((uint)fVar16)
                                    ,ZEXT416((uint)(fVar2 * pfVar6[uVar36])));
          pfVar6[uVar36] = auVar14._0_4_;
          uVar36 = uVar36 + 1;
        } while (uVar30 != uVar36);
      }
      uVar31 = (uVar31 & 0xfffffffffffffff0) + uVar30;
      if (0xf < (long)uVar25) {
        auVar42 = vbroadcastss_avx512f(ZEXT416((uint)fVar2));
        auVar43 = vbroadcastss_avx512f(ZEXT416((uint)(fVar16 * local_264)));
        do {
          auVar44 = vmulps_avx512f(auVar42,*(undefined1 (*) [64])(pfVar6 + uVar30));
          auVar45 = vmulps_avx512f(*(undefined1 (*) [64])(pfVar7 + uVar30),
                                   *(undefined1 (*) [64])(pfVar7 + uVar30));
          auVar44 = vfmadd213ps_avx512f(auVar45,auVar43,auVar44);
          *(undefined1 (*) [64])(pfVar6 + uVar30) = auVar44;
          uVar30 = uVar30 + 0x10;
        } while ((long)uVar30 < (long)uVar31);
      }
      if ((long)uVar31 < (long)uVar22) {
        do {
          auVar14 = vfmadd213ss_fma(ZEXT416((uint)(local_278 * pfVar7[uVar31] *
                                                  local_278 * pfVar7[uVar31])),ZEXT416((uint)fVar16)
                                    ,ZEXT416((uint)(fVar2 * pfVar6[uVar31])));
          pfVar6[uVar31] = auVar14._0_4_;
          uVar31 = uVar31 + 1;
        } while (uVar22 != uVar31);
      }
      local_270 = (LookupParameters *)pSVar8[uVar20].h.v;
      uVar22 = (ulong)pSVar8[uVar20].h.d.nd;
      if (uVar22 == 0) {
        iVar76 = 1;
      }
      else {
        auVar42 = vpbroadcastq_avx512f();
        uVar30 = 0;
        auVar43 = vmovdqa64_avx512f(auVar39);
        do {
          auVar44 = vmovdqa64_avx512f(auVar43);
          auVar43 = vpbroadcastq_avx512f();
          auVar45 = vporq_avx512f(auVar43,auVar40);
          auVar43 = vporq_avx512f(auVar43,auVar41);
          uVar17 = vpcmpuq_avx512f(auVar43,auVar42,2);
          bVar18 = (byte)uVar17;
          uVar17 = vpcmpuq_avx512f(auVar45,auVar42,2);
          bVar19 = (byte)uVar17;
          uVar37 = CONCAT11(bVar19,bVar18);
          auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar8[uVar20].h.d.d + uVar30 * 4));
          auVar52._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar43._4_4_;
          auVar52._0_4_ = (uint)(bVar18 & 1) * auVar43._0_4_;
          auVar52._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar43._8_4_;
          auVar52._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar43._12_4_;
          auVar52._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar43._16_4_;
          auVar52._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar43._20_4_;
          auVar52._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar43._24_4_;
          auVar52._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar43._28_4_;
          auVar52._32_4_ = (uint)(bVar19 & 1) * auVar43._32_4_;
          auVar52._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar43._36_4_;
          auVar52._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar43._40_4_;
          auVar52._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar43._44_4_;
          auVar52._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar43._48_4_;
          auVar52._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar43._52_4_;
          auVar52._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar43._56_4_;
          auVar52._60_4_ = (uint)(bVar19 >> 7) * auVar43._60_4_;
          auVar43 = vpmulld_avx512f(auVar52,auVar44);
          uVar30 = uVar30 + 0x10;
        } while ((uVar22 + 0xf & 0x1fffffff0) != uVar30);
        auVar42 = vmovdqa32_avx512f(auVar43);
        auVar53._0_4_ =
             (uint)(bVar18 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar44._0_4_;
        bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
        auVar53._4_4_ = (uint)bVar13 * auVar42._4_4_ | (uint)!bVar13 * auVar44._4_4_;
        bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
        auVar53._8_4_ = (uint)bVar13 * auVar42._8_4_ | (uint)!bVar13 * auVar44._8_4_;
        bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
        auVar53._12_4_ = (uint)bVar13 * auVar42._12_4_ | (uint)!bVar13 * auVar44._12_4_;
        bVar13 = (bool)((byte)(uVar37 >> 4) & 1);
        auVar53._16_4_ = (uint)bVar13 * auVar42._16_4_ | (uint)!bVar13 * auVar44._16_4_;
        bVar13 = (bool)((byte)(uVar37 >> 5) & 1);
        auVar53._20_4_ = (uint)bVar13 * auVar42._20_4_ | (uint)!bVar13 * auVar44._20_4_;
        bVar13 = (bool)((byte)(uVar37 >> 6) & 1);
        auVar53._24_4_ = (uint)bVar13 * auVar42._24_4_ | (uint)!bVar13 * auVar44._24_4_;
        bVar13 = (bool)((byte)(uVar37 >> 7) & 1);
        auVar53._28_4_ = (uint)bVar13 * auVar42._28_4_ | (uint)!bVar13 * auVar44._28_4_;
        auVar53._32_4_ =
             (uint)(bVar19 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar44._32_4_;
        bVar13 = (bool)(bVar19 >> 1 & 1);
        auVar53._36_4_ = (uint)bVar13 * auVar42._36_4_ | (uint)!bVar13 * auVar44._36_4_;
        bVar13 = (bool)(bVar19 >> 2 & 1);
        auVar53._40_4_ = (uint)bVar13 * auVar42._40_4_ | (uint)!bVar13 * auVar44._40_4_;
        bVar13 = (bool)(bVar19 >> 3 & 1);
        auVar53._44_4_ = (uint)bVar13 * auVar42._44_4_ | (uint)!bVar13 * auVar44._44_4_;
        bVar13 = (bool)(bVar19 >> 4 & 1);
        auVar53._48_4_ = (uint)bVar13 * auVar42._48_4_ | (uint)!bVar13 * auVar44._48_4_;
        bVar13 = (bool)(bVar19 >> 5 & 1);
        auVar53._52_4_ = (uint)bVar13 * auVar42._52_4_ | (uint)!bVar13 * auVar44._52_4_;
        bVar13 = (bool)(bVar19 >> 6 & 1);
        auVar53._56_4_ = (uint)bVar13 * auVar42._56_4_ | (uint)!bVar13 * auVar44._56_4_;
        auVar53._60_4_ =
             (uint)(bVar19 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar44._60_4_;
        auVar38 = vextracti64x4_avx512f(auVar53,1);
        auVar42 = vpmulld_avx512f(auVar53,ZEXT3264(auVar38));
        auVar14 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
        auVar15 = vpshufd_avx(auVar14,0xee);
        auVar14 = vpmulld_avx(auVar14,auVar15);
        auVar15 = vpshufd_avx(auVar14,0x55);
        auVar14 = vpmulld_avx(auVar14,auVar15);
        iVar76 = auVar14._0_4_;
      }
      uVar29 = pSVar8[uVar20].h.d.bd;
      uVar32 = iVar76 * uVar29;
      uVar30 = (ulong)uVar32;
      local_238 = pPVar4;
      local_218 = uVar20;
      if (uVar34 != uVar32) goto LAB_00255dfe;
      uVar31 = (ulong)pSVar5[uVar20].h.d.nd;
      if (uVar31 == 0) {
        iVar76 = 1;
      }
      else {
        auVar42 = vpbroadcastq_avx512f();
        uVar25 = 0;
        auVar43 = vmovdqa64_avx512f(auVar39);
        do {
          auVar44 = vmovdqa64_avx512f(auVar43);
          auVar43 = vpbroadcastq_avx512f();
          auVar45 = vporq_avx512f(auVar43,auVar40);
          auVar43 = vporq_avx512f(auVar43,auVar41);
          uVar17 = vpcmpuq_avx512f(auVar43,auVar42,2);
          bVar18 = (byte)uVar17;
          uVar17 = vpcmpuq_avx512f(auVar45,auVar42,2);
          bVar19 = (byte)uVar17;
          uVar37 = CONCAT11(bVar19,bVar18);
          auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar5[uVar20].h.d.d + uVar25 * 4));
          auVar54._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar43._4_4_;
          auVar54._0_4_ = (uint)(bVar18 & 1) * auVar43._0_4_;
          auVar54._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar43._8_4_;
          auVar54._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar43._12_4_;
          auVar54._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar43._16_4_;
          auVar54._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar43._20_4_;
          auVar54._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar43._24_4_;
          auVar54._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar43._28_4_;
          auVar54._32_4_ = (uint)(bVar19 & 1) * auVar43._32_4_;
          auVar54._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar43._36_4_;
          auVar54._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar43._40_4_;
          auVar54._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar43._44_4_;
          auVar54._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar43._48_4_;
          auVar54._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar43._52_4_;
          auVar54._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar43._56_4_;
          auVar54._60_4_ = (uint)(bVar19 >> 7) * auVar43._60_4_;
          auVar43 = vpmulld_avx512f(auVar54,auVar44);
          uVar25 = uVar25 + 0x10;
        } while ((uVar31 + 0xf & 0x1fffffff0) != uVar25);
        auVar43 = vmovdqa32_avx512f(auVar43);
        auVar42._0_4_ =
             (uint)(bVar18 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar44._0_4_;
        bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
        auVar42._4_4_ = (uint)bVar13 * auVar43._4_4_ | (uint)!bVar13 * auVar44._4_4_;
        bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
        auVar42._8_4_ = (uint)bVar13 * auVar43._8_4_ | (uint)!bVar13 * auVar44._8_4_;
        bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
        auVar42._12_4_ = (uint)bVar13 * auVar43._12_4_ | (uint)!bVar13 * auVar44._12_4_;
        bVar13 = (bool)((byte)(uVar37 >> 4) & 1);
        auVar42._16_4_ = (uint)bVar13 * auVar43._16_4_ | (uint)!bVar13 * auVar44._16_4_;
        bVar13 = (bool)((byte)(uVar37 >> 5) & 1);
        auVar42._20_4_ = (uint)bVar13 * auVar43._20_4_ | (uint)!bVar13 * auVar44._20_4_;
        bVar13 = (bool)((byte)(uVar37 >> 6) & 1);
        auVar42._24_4_ = (uint)bVar13 * auVar43._24_4_ | (uint)!bVar13 * auVar44._24_4_;
        bVar13 = (bool)((byte)(uVar37 >> 7) & 1);
        auVar42._28_4_ = (uint)bVar13 * auVar43._28_4_ | (uint)!bVar13 * auVar44._28_4_;
        auVar42._32_4_ =
             (uint)(bVar19 & 1) * auVar43._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar44._32_4_;
        bVar13 = (bool)(bVar19 >> 1 & 1);
        auVar42._36_4_ = (uint)bVar13 * auVar43._36_4_ | (uint)!bVar13 * auVar44._36_4_;
        bVar13 = (bool)(bVar19 >> 2 & 1);
        auVar42._40_4_ = (uint)bVar13 * auVar43._40_4_ | (uint)!bVar13 * auVar44._40_4_;
        bVar13 = (bool)(bVar19 >> 3 & 1);
        auVar42._44_4_ = (uint)bVar13 * auVar43._44_4_ | (uint)!bVar13 * auVar44._44_4_;
        bVar13 = (bool)(bVar19 >> 4 & 1);
        auVar42._48_4_ = (uint)bVar13 * auVar43._48_4_ | (uint)!bVar13 * auVar44._48_4_;
        bVar13 = (bool)(bVar19 >> 5 & 1);
        auVar42._52_4_ = (uint)bVar13 * auVar43._52_4_ | (uint)!bVar13 * auVar44._52_4_;
        bVar13 = (bool)(bVar19 >> 6 & 1);
        auVar42._56_4_ = (uint)bVar13 * auVar43._56_4_ | (uint)!bVar13 * auVar44._56_4_;
        auVar42._60_4_ =
             (uint)(bVar19 >> 7) * auVar43._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar44._60_4_;
        auVar38 = vextracti64x4_avx512f(auVar42,1);
        auVar42 = vpmulld_avx512f(auVar42,ZEXT3264(auVar38));
        auVar14 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
        auVar15 = vpshufd_avx(auVar14,0xee);
        auVar14 = vpmulld_avx(auVar14,auVar15);
        auVar15 = vpshufd_avx(auVar14,0x55);
        auVar14 = vpmulld_avx(auVar14,auVar15);
        iVar76 = auVar14._0_4_;
      }
      uVar34 = iVar76 * pSVar5[uVar20].h.d.bd;
      pLVar26 = (LookupParameters *)(ulong)uVar34;
      if (uVar32 - uVar34 != 0) goto LAB_00255e5a;
      if (uVar22 == 0) {
        iVar76 = 1;
      }
      else {
        auVar42 = vpbroadcastq_avx512f();
        uVar31 = 0;
        auVar43 = vmovdqa64_avx512f(auVar39);
        do {
          auVar44 = vmovdqa64_avx512f(auVar43);
          auVar43 = vpbroadcastq_avx512f();
          auVar45 = vporq_avx512f(auVar43,auVar40);
          auVar43 = vporq_avx512f(auVar43,auVar41);
          uVar17 = vpcmpuq_avx512f(auVar43,auVar42,2);
          bVar18 = (byte)uVar17;
          uVar17 = vpcmpuq_avx512f(auVar45,auVar42,2);
          bVar19 = (byte)uVar17;
          uVar37 = CONCAT11(bVar19,bVar18);
          auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar8[uVar20].h.d.d + uVar31 * 4));
          auVar55._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar43._4_4_;
          auVar55._0_4_ = (uint)(bVar18 & 1) * auVar43._0_4_;
          auVar55._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar43._8_4_;
          auVar55._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar43._12_4_;
          auVar55._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar43._16_4_;
          auVar55._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar43._20_4_;
          auVar55._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar43._24_4_;
          auVar55._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar43._28_4_;
          auVar55._32_4_ = (uint)(bVar19 & 1) * auVar43._32_4_;
          auVar55._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar43._36_4_;
          auVar55._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar43._40_4_;
          auVar55._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar43._44_4_;
          auVar55._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar43._48_4_;
          auVar55._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar43._52_4_;
          auVar55._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar43._56_4_;
          auVar55._60_4_ = (uint)(bVar19 >> 7) * auVar43._60_4_;
          auVar43 = vpmulld_avx512f(auVar55,auVar44);
          uVar31 = uVar31 + 0x10;
        } while ((uVar22 + 0xf & 0x1fffffff0) != uVar31);
        auVar42 = vmovdqa32_avx512f(auVar43);
        auVar56._0_4_ =
             (uint)(bVar18 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar44._0_4_;
        bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
        auVar56._4_4_ = (uint)bVar13 * auVar42._4_4_ | (uint)!bVar13 * auVar44._4_4_;
        bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
        auVar56._8_4_ = (uint)bVar13 * auVar42._8_4_ | (uint)!bVar13 * auVar44._8_4_;
        bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
        auVar56._12_4_ = (uint)bVar13 * auVar42._12_4_ | (uint)!bVar13 * auVar44._12_4_;
        bVar13 = (bool)((byte)(uVar37 >> 4) & 1);
        auVar56._16_4_ = (uint)bVar13 * auVar42._16_4_ | (uint)!bVar13 * auVar44._16_4_;
        bVar13 = (bool)((byte)(uVar37 >> 5) & 1);
        auVar56._20_4_ = (uint)bVar13 * auVar42._20_4_ | (uint)!bVar13 * auVar44._20_4_;
        bVar13 = (bool)((byte)(uVar37 >> 6) & 1);
        auVar56._24_4_ = (uint)bVar13 * auVar42._24_4_ | (uint)!bVar13 * auVar44._24_4_;
        bVar13 = (bool)((byte)(uVar37 >> 7) & 1);
        auVar56._28_4_ = (uint)bVar13 * auVar42._28_4_ | (uint)!bVar13 * auVar44._28_4_;
        auVar56._32_4_ =
             (uint)(bVar19 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar44._32_4_;
        bVar13 = (bool)(bVar19 >> 1 & 1);
        auVar56._36_4_ = (uint)bVar13 * auVar42._36_4_ | (uint)!bVar13 * auVar44._36_4_;
        bVar13 = (bool)(bVar19 >> 2 & 1);
        auVar56._40_4_ = (uint)bVar13 * auVar42._40_4_ | (uint)!bVar13 * auVar44._40_4_;
        bVar13 = (bool)(bVar19 >> 3 & 1);
        auVar56._44_4_ = (uint)bVar13 * auVar42._44_4_ | (uint)!bVar13 * auVar44._44_4_;
        bVar13 = (bool)(bVar19 >> 4 & 1);
        auVar56._48_4_ = (uint)bVar13 * auVar42._48_4_ | (uint)!bVar13 * auVar44._48_4_;
        bVar13 = (bool)(bVar19 >> 5 & 1);
        auVar56._52_4_ = (uint)bVar13 * auVar42._52_4_ | (uint)!bVar13 * auVar44._52_4_;
        bVar13 = (bool)(bVar19 >> 6 & 1);
        auVar56._56_4_ = (uint)bVar13 * auVar42._56_4_ | (uint)!bVar13 * auVar44._56_4_;
        auVar56._60_4_ =
             (uint)(bVar19 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar44._60_4_;
        auVar38 = vextracti64x4_avx512f(auVar56,1);
        auVar42 = vpmulld_avx512f(auVar56,ZEXT3264(auVar38));
        auVar14 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
        auVar15 = vpshufd_avx(auVar14,0xee);
        auVar14 = vpmulld_avx(auVar14,auVar15);
        auVar15 = vpshufd_avx(auVar14,0x55);
        auVar14 = vpmulld_avx(auVar14,auVar15);
        iVar76 = auVar14._0_4_;
      }
      uVar29 = iVar76 * uVar29;
      if (uVar29 != uVar34) goto LAB_00255e15;
      uVar22 = (ulong)pSVar8[uVar20].h.d.nd;
      if (uVar22 == 0) {
        iVar76 = 1;
      }
      else {
        auVar42 = vpbroadcastq_avx512f();
        uVar31 = 0;
        auVar39 = vmovdqa64_avx512f(auVar39);
        do {
          auVar43 = vmovdqa64_avx512f(auVar39);
          auVar39 = vpbroadcastq_avx512f();
          auVar44 = vporq_avx512f(auVar39,auVar40);
          auVar39 = vporq_avx512f(auVar39,auVar41);
          uVar17 = vpcmpuq_avx512f(auVar39,auVar42,2);
          bVar18 = (byte)uVar17;
          uVar17 = vpcmpuq_avx512f(auVar44,auVar42,2);
          bVar19 = (byte)uVar17;
          uVar37 = CONCAT11(bVar19,bVar18);
          auVar39 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar8[uVar20].h.d.d + uVar31 * 4));
          auVar44._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar39._4_4_;
          auVar44._0_4_ = (uint)(bVar18 & 1) * auVar39._0_4_;
          auVar44._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar39._8_4_;
          auVar44._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar39._12_4_;
          auVar44._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar39._16_4_;
          auVar44._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar39._20_4_;
          auVar44._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar39._24_4_;
          auVar44._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar39._28_4_;
          auVar44._32_4_ = (uint)(bVar19 & 1) * auVar39._32_4_;
          auVar44._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar39._36_4_;
          auVar44._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar39._40_4_;
          auVar44._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar39._44_4_;
          auVar44._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar39._48_4_;
          auVar44._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar39._52_4_;
          auVar44._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar39._56_4_;
          auVar44._60_4_ = (uint)(bVar19 >> 7) * auVar39._60_4_;
          auVar39 = vpmulld_avx512f(auVar44,auVar43);
          uVar31 = uVar31 + 0x10;
        } while ((uVar22 + 0xf & 0x1fffffff0) != uVar31);
        auVar39 = vmovdqa32_avx512f(auVar39);
        auVar40._0_4_ =
             (uint)(bVar18 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar43._0_4_;
        bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
        auVar40._4_4_ = (uint)bVar13 * auVar39._4_4_ | (uint)!bVar13 * auVar43._4_4_;
        bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
        auVar40._8_4_ = (uint)bVar13 * auVar39._8_4_ | (uint)!bVar13 * auVar43._8_4_;
        bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
        auVar40._12_4_ = (uint)bVar13 * auVar39._12_4_ | (uint)!bVar13 * auVar43._12_4_;
        bVar13 = (bool)((byte)(uVar37 >> 4) & 1);
        auVar40._16_4_ = (uint)bVar13 * auVar39._16_4_ | (uint)!bVar13 * auVar43._16_4_;
        bVar13 = (bool)((byte)(uVar37 >> 5) & 1);
        auVar40._20_4_ = (uint)bVar13 * auVar39._20_4_ | (uint)!bVar13 * auVar43._20_4_;
        bVar13 = (bool)((byte)(uVar37 >> 6) & 1);
        auVar40._24_4_ = (uint)bVar13 * auVar39._24_4_ | (uint)!bVar13 * auVar43._24_4_;
        bVar13 = (bool)((byte)(uVar37 >> 7) & 1);
        auVar40._28_4_ = (uint)bVar13 * auVar39._28_4_ | (uint)!bVar13 * auVar43._28_4_;
        auVar40._32_4_ =
             (uint)(bVar19 & 1) * auVar39._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar43._32_4_;
        bVar13 = (bool)(bVar19 >> 1 & 1);
        auVar40._36_4_ = (uint)bVar13 * auVar39._36_4_ | (uint)!bVar13 * auVar43._36_4_;
        bVar13 = (bool)(bVar19 >> 2 & 1);
        auVar40._40_4_ = (uint)bVar13 * auVar39._40_4_ | (uint)!bVar13 * auVar43._40_4_;
        bVar13 = (bool)(bVar19 >> 3 & 1);
        auVar40._44_4_ = (uint)bVar13 * auVar39._44_4_ | (uint)!bVar13 * auVar43._44_4_;
        bVar13 = (bool)(bVar19 >> 4 & 1);
        auVar40._48_4_ = (uint)bVar13 * auVar39._48_4_ | (uint)!bVar13 * auVar43._48_4_;
        bVar13 = (bool)(bVar19 >> 5 & 1);
        auVar40._52_4_ = (uint)bVar13 * auVar39._52_4_ | (uint)!bVar13 * auVar43._52_4_;
        bVar13 = (bool)(bVar19 >> 6 & 1);
        auVar40._56_4_ = (uint)bVar13 * auVar39._56_4_ | (uint)!bVar13 * auVar43._56_4_;
        auVar40._60_4_ =
             (uint)(bVar19 >> 7) * auVar39._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar43._60_4_;
        auVar38 = vextracti64x4_avx512f(auVar40,1);
        auVar39 = vpmulld_avx512f(auVar40,ZEXT3264(auVar38));
        auVar14 = vpmulld_avx(auVar39._0_16_,auVar39._16_16_);
        auVar15 = vpshufd_avx(auVar14,0xee);
        auVar14 = vpmulld_avx(auVar14,auVar15);
        auVar15 = vpshufd_avx(auVar14,0x55);
        auVar14 = vpmulld_avx(auVar14,auVar15);
        iVar76 = auVar14._0_4_;
      }
      local_d8.m_other = local_220->epsilon;
      pfVar6 = pSVar5[uVar20].h.v;
      local_1f0 = pSVar8[uVar20].h.v;
      uVar32 = iVar76 * pSVar8[uVar20].h.d.bd;
      local_1e8 = (ulong)uVar32;
      stack0xfffffffffffffe50 = (pointer)CONCAT44(local_220->rho,local_1b8._8_4_);
      local_188 = (float *)CONCAT44(1.0 - local_220->rho,(undefined4)local_188);
      local_108.m_functor.m_other = local_d8.m_other;
      local_1f8 = (pointer)CONCAT44(local_1f8._4_4_,local_d8.m_other);
      local_274 = rVar1;
      local_1a0 = local_270;
      local_190.m_value = (ulong)uVar29;
      local_154.m_other = local_278;
      local_148 = pfVar7;
      local_138.m_value = uVar24;
      local_120 = local_270;
      local_110.m_value = uVar30;
      local_f0 = pfVar6;
      local_e0.m_value = (long)pLVar26;
      local_b4.m_other = local_278;
      local_a8 = pfVar7;
      local_98.m_value = uVar24;
      local_80 = local_270;
      local_70.m_value = uVar30;
      local_68.m_other = local_d8.m_other;
      local_50 = pfVar6;
      local_40.m_value = (long)pLVar26;
      local_38.m_other = local_d8.m_other;
      if (uVar32 != uVar34) goto LAB_00255dba;
      local_258.m_dst = (DstEvaluatorType *)local_1d8;
      local_258.m_src = (SrcEvaluatorType *)local_1b8;
      local_258.m_functor = &local_279;
      local_258.m_dstExpr = (DstXprType *)&local_1f0;
      local_1d8[0] = local_1f0;
      local_1c8 = local_1e8;
      local_1a0 = local_270;
      local_120 = local_270;
      local_80 = local_270;
      Eigen::internal::dense_assignment_loop<$6ae401cf$>::run(&local_258);
      this_00 = local_238;
      if (uVar34 - (uint)local_230 != 0) goto LAB_00255e43;
      uVar20 = (ulong)(local_238->values).d.nd;
      auVar39 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar40 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      if (uVar20 == 0) {
        iVar76 = 1;
      }
      else {
        auVar42 = vpbroadcastq_avx512f();
        uVar22 = 0;
        do {
          auVar43 = vmovdqa64_avx512f(auVar39);
          auVar39 = vpbroadcastq_avx512f();
          auVar44 = vporq_avx512f(auVar39,auVar40);
          auVar39 = vporq_avx512f(auVar39,auVar41);
          uVar17 = vpcmpuq_avx512f(auVar39,auVar42,2);
          bVar18 = (byte)uVar17;
          uVar17 = vpcmpuq_avx512f(auVar44,auVar42,2);
          bVar19 = (byte)uVar17;
          uVar37 = CONCAT11(bVar19,bVar18);
          auVar39 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)&(((_Vector_impl *)(pPVar4->values).d.d)->
                                               super__Vector_impl_data)._M_start + uVar22 * 4));
          auVar57._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar39._4_4_;
          auVar57._0_4_ = (uint)(bVar18 & 1) * auVar39._0_4_;
          auVar57._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar39._8_4_;
          auVar57._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar39._12_4_;
          auVar57._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar39._16_4_;
          auVar57._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar39._20_4_;
          auVar57._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar39._24_4_;
          auVar57._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar39._28_4_;
          auVar57._32_4_ = (uint)(bVar19 & 1) * auVar39._32_4_;
          auVar57._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar39._36_4_;
          auVar57._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar39._40_4_;
          auVar57._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar39._44_4_;
          auVar57._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar39._48_4_;
          auVar57._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar39._52_4_;
          auVar57._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar39._56_4_;
          auVar57._60_4_ = (uint)(bVar19 >> 7) * auVar39._60_4_;
          auVar39 = vpmulld_avx512f(auVar57,auVar43);
          uVar22 = uVar22 + 0x10;
        } while ((uVar20 + 0xf & 0x1fffffff0) != uVar22);
        auVar39 = vmovdqa32_avx512f(auVar39);
        auVar41._0_4_ =
             (uint)(bVar18 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar43._0_4_;
        bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
        auVar41._4_4_ = (uint)bVar13 * auVar39._4_4_ | (uint)!bVar13 * auVar43._4_4_;
        bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
        auVar41._8_4_ = (uint)bVar13 * auVar39._8_4_ | (uint)!bVar13 * auVar43._8_4_;
        bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
        auVar41._12_4_ = (uint)bVar13 * auVar39._12_4_ | (uint)!bVar13 * auVar43._12_4_;
        bVar13 = (bool)((byte)(uVar37 >> 4) & 1);
        auVar41._16_4_ = (uint)bVar13 * auVar39._16_4_ | (uint)!bVar13 * auVar43._16_4_;
        bVar13 = (bool)((byte)(uVar37 >> 5) & 1);
        auVar41._20_4_ = (uint)bVar13 * auVar39._20_4_ | (uint)!bVar13 * auVar43._20_4_;
        bVar13 = (bool)((byte)(uVar37 >> 6) & 1);
        auVar41._24_4_ = (uint)bVar13 * auVar39._24_4_ | (uint)!bVar13 * auVar43._24_4_;
        bVar13 = (bool)((byte)(uVar37 >> 7) & 1);
        auVar41._28_4_ = (uint)bVar13 * auVar39._28_4_ | (uint)!bVar13 * auVar43._28_4_;
        auVar41._32_4_ =
             (uint)(bVar19 & 1) * auVar39._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar43._32_4_;
        bVar13 = (bool)(bVar19 >> 1 & 1);
        auVar41._36_4_ = (uint)bVar13 * auVar39._36_4_ | (uint)!bVar13 * auVar43._36_4_;
        bVar13 = (bool)(bVar19 >> 2 & 1);
        auVar41._40_4_ = (uint)bVar13 * auVar39._40_4_ | (uint)!bVar13 * auVar43._40_4_;
        bVar13 = (bool)(bVar19 >> 3 & 1);
        auVar41._44_4_ = (uint)bVar13 * auVar39._44_4_ | (uint)!bVar13 * auVar43._44_4_;
        bVar13 = (bool)(bVar19 >> 4 & 1);
        auVar41._48_4_ = (uint)bVar13 * auVar39._48_4_ | (uint)!bVar13 * auVar43._48_4_;
        bVar13 = (bool)(bVar19 >> 5 & 1);
        auVar41._52_4_ = (uint)bVar13 * auVar39._52_4_ | (uint)!bVar13 * auVar43._52_4_;
        bVar13 = (bool)(bVar19 >> 6 & 1);
        auVar41._56_4_ = (uint)bVar13 * auVar39._56_4_ | (uint)!bVar13 * auVar43._56_4_;
        auVar41._60_4_ =
             (uint)(bVar19 >> 7) * auVar39._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar43._60_4_;
        auVar38 = vextracti64x4_avx512f(auVar41,1);
        auVar39 = vpmulld_avx512f(auVar41,ZEXT3264(auVar38));
        auVar14 = vpmulld_avx(auVar39._0_16_,auVar39._16_16_);
        auVar15 = vpshufd_avx(auVar14,0xee);
        auVar14 = vpmulld_avx(auVar14,auVar15);
        auVar15 = vpshufd_avx(auVar14,0x55);
        auVar14 = vpmulld_avx(auVar14,auVar15);
        iVar76 = auVar14._0_4_;
      }
      local_1f0 = (local_238->values).v;
      uVar29 = iVar76 * (local_238->values).d.bd;
      local_1e8 = (ulong)uVar29;
      local_194 = local_278;
      local_160 = local_270;
      local_148 = (float *)CONCAT44(local_148._4_4_,local_1f8._0_4_);
      local_118 = local_1f8._0_4_;
      local_108 = local_210;
      local_f8 = local_230;
      local_f0 = (float *)CONCAT44(local_f0._4_4_,local_274);
      local_188 = pfVar7;
      local_178 = uVar24;
      local_150 = uVar30;
      local_130 = pfVar6;
      local_120 = pLVar26;
      if (uVar29 != (uint)local_230) {
LAB_00255ddc:
        local_194 = local_278;
        local_f8 = local_230;
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                     );
      }
      local_258.m_dst = (DstEvaluatorType *)local_1d8;
      local_258.m_src = (SrcEvaluatorType *)local_1b8;
      local_258.m_functor = &local_279;
      local_258.m_dstExpr = (DstXprType *)&local_1f0;
      local_1d8[0] = local_1f0;
      local_1c8 = local_1e8;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,_-1,_1,_0,_-1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,_-1,_1,_0,_-1,_1>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>_>_>,_Eigen::internal::add_assign_op<float,_float>,_0>,_3,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>,_Eigen::internal::add_assign_op<float,_float>,_0>
             *)&local_258);
      Parameters::clear(this_00);
      uVar20 = (ulong)((int)local_218 + 1);
      eVar33 = (evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                )((long)local_208 + 8);
      auVar39 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar40 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    } while (eVar33 != local_200);
  }
  pMVar3 = (local_220->super_Trainer).model;
  puVar23 = *(ulong **)(pMVar3 + 0x30);
  local_1c0 = *(ulong **)(pMVar3 + 0x38);
  pAVar27 = local_220;
  if (puVar23 != local_1c0) {
    local_278 = local_228._0_4_ * (float)local_260;
    local_264 = local_278 * local_278;
    local_260 = 0;
    auVar41 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar40 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar39 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      local_270 = (LookupParameters *)*puVar23;
      eVar33 = (evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                )(local_270->non_zero_grads)._M_h._M_before_begin._M_nxt;
      local_228 = puVar23;
      if (eVar33 != (evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                     )0x0) {
        local_1f8 = (pAVar27->hlg).
                    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                    ._M_impl.super__Vector_impl_data._M_start + local_260;
        local_200 = (evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                     )((pAVar27->hld).
                       super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                       ._M_impl.super__Vector_impl_data._M_start + local_260);
        do {
          uVar20 = (ulong)*(uint *)((long)eVar33 + 8);
          pTVar9 = (local_270->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar22 = (ulong)pTVar9[uVar20].d.nd;
          iVar76 = 1;
          iVar77 = 1;
          if (uVar22 != 0) {
            auVar42 = vpbroadcastq_avx512f();
            uVar24 = 0;
            auVar43 = vmovdqa64_avx512f(auVar41);
            do {
              auVar44 = vmovdqa64_avx512f(auVar43);
              auVar43 = vpbroadcastq_avx512f();
              auVar45 = vporq_avx512f(auVar43,auVar40);
              auVar43 = vporq_avx512f(auVar43,auVar39);
              uVar17 = vpcmpuq_avx512f(auVar43,auVar42,2);
              bVar18 = (byte)uVar17;
              uVar17 = vpcmpuq_avx512f(auVar45,auVar42,2);
              bVar19 = (byte)uVar17;
              uVar37 = CONCAT11(bVar19,bVar18);
              auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar9[uVar20].d.d + uVar24));
              auVar58._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar43._4_4_;
              auVar58._0_4_ = (uint)(bVar18 & 1) * auVar43._0_4_;
              auVar58._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar43._8_4_;
              auVar58._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar43._12_4_;
              auVar58._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar43._16_4_;
              auVar58._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar43._20_4_;
              auVar58._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar43._24_4_;
              auVar58._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar43._28_4_;
              auVar58._32_4_ = (uint)(bVar19 & 1) * auVar43._32_4_;
              auVar58._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar43._36_4_;
              auVar58._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar43._40_4_;
              auVar58._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar43._44_4_;
              auVar58._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar43._48_4_;
              auVar58._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar43._52_4_;
              auVar58._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar43._56_4_;
              auVar58._60_4_ = (uint)(bVar19 >> 7) * auVar43._60_4_;
              auVar43 = vpmulld_avx512f(auVar58,auVar44);
              uVar24 = uVar24 + 0x10;
            } while ((uVar22 + 0xf & 0x1fffffff0) != uVar24);
            auVar42 = vmovdqa32_avx512f(auVar43);
            auVar59._0_4_ =
                 (uint)(bVar18 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar44._0_4_;
            bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar59._4_4_ = (uint)bVar13 * auVar42._4_4_ | (uint)!bVar13 * auVar44._4_4_;
            bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar59._8_4_ = (uint)bVar13 * auVar42._8_4_ | (uint)!bVar13 * auVar44._8_4_;
            bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
            auVar59._12_4_ = (uint)bVar13 * auVar42._12_4_ | (uint)!bVar13 * auVar44._12_4_;
            bVar13 = (bool)((byte)(uVar37 >> 4) & 1);
            auVar59._16_4_ = (uint)bVar13 * auVar42._16_4_ | (uint)!bVar13 * auVar44._16_4_;
            bVar13 = (bool)((byte)(uVar37 >> 5) & 1);
            auVar59._20_4_ = (uint)bVar13 * auVar42._20_4_ | (uint)!bVar13 * auVar44._20_4_;
            bVar13 = (bool)((byte)(uVar37 >> 6) & 1);
            auVar59._24_4_ = (uint)bVar13 * auVar42._24_4_ | (uint)!bVar13 * auVar44._24_4_;
            bVar13 = (bool)((byte)(uVar37 >> 7) & 1);
            auVar59._28_4_ = (uint)bVar13 * auVar42._28_4_ | (uint)!bVar13 * auVar44._28_4_;
            auVar59._32_4_ =
                 (uint)(bVar19 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar44._32_4_;
            bVar13 = (bool)(bVar19 >> 1 & 1);
            auVar59._36_4_ = (uint)bVar13 * auVar42._36_4_ | (uint)!bVar13 * auVar44._36_4_;
            bVar13 = (bool)(bVar19 >> 2 & 1);
            auVar59._40_4_ = (uint)bVar13 * auVar42._40_4_ | (uint)!bVar13 * auVar44._40_4_;
            bVar13 = (bool)(bVar19 >> 3 & 1);
            auVar59._44_4_ = (uint)bVar13 * auVar42._44_4_ | (uint)!bVar13 * auVar44._44_4_;
            bVar13 = (bool)(bVar19 >> 4 & 1);
            auVar59._48_4_ = (uint)bVar13 * auVar42._48_4_ | (uint)!bVar13 * auVar44._48_4_;
            bVar13 = (bool)(bVar19 >> 5 & 1);
            auVar59._52_4_ = (uint)bVar13 * auVar42._52_4_ | (uint)!bVar13 * auVar44._52_4_;
            bVar13 = (bool)(bVar19 >> 6 & 1);
            auVar59._56_4_ = (uint)bVar13 * auVar42._56_4_ | (uint)!bVar13 * auVar44._56_4_;
            auVar59._60_4_ =
                 (uint)(bVar19 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar44._60_4_;
            auVar38 = vextracti64x4_avx512f(auVar59,1);
            auVar42 = vpmulld_avx512f(auVar59,ZEXT3264(auVar38));
            auVar14 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
            auVar15 = vpshufd_avx(auVar14,0xee);
            auVar14 = vpmulld_avx(auVar14,auVar15);
            auVar15 = vpshufd_avx(auVar14,0x55);
            auVar14 = vpmulld_avx(auVar14,auVar15);
            iVar77 = auVar14._0_4_;
          }
          pTVar10 = (local_270->values).
                    super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pPVar4 = (Parameters *)(uVar20 * 9);
          uVar22 = (ulong)pTVar10[uVar20].d.nd;
          if (uVar22 != 0) {
            auVar42 = vpbroadcastq_avx512f();
            uVar24 = 0;
            auVar43 = vmovdqa64_avx512f(auVar41);
            do {
              auVar44 = vmovdqa64_avx512f(auVar43);
              auVar43 = vpbroadcastq_avx512f();
              auVar45 = vporq_avx512f(auVar43,auVar40);
              auVar43 = vporq_avx512f(auVar43,auVar39);
              uVar17 = vpcmpuq_avx512f(auVar43,auVar42,2);
              bVar18 = (byte)uVar17;
              uVar17 = vpcmpuq_avx512f(auVar45,auVar42,2);
              bVar19 = (byte)uVar17;
              uVar37 = CONCAT11(bVar19,bVar18);
              auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar10[uVar20].d.d + uVar24));
              auVar60._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar43._4_4_;
              auVar60._0_4_ = (uint)(bVar18 & 1) * auVar43._0_4_;
              auVar60._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar43._8_4_;
              auVar60._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar43._12_4_;
              auVar60._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar43._16_4_;
              auVar60._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar43._20_4_;
              auVar60._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar43._24_4_;
              auVar60._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar43._28_4_;
              auVar60._32_4_ = (uint)(bVar19 & 1) * auVar43._32_4_;
              auVar60._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar43._36_4_;
              auVar60._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar43._40_4_;
              auVar60._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar43._44_4_;
              auVar60._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar43._48_4_;
              auVar60._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar43._52_4_;
              auVar60._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar43._56_4_;
              auVar60._60_4_ = (uint)(bVar19 >> 7) * auVar43._60_4_;
              auVar43 = vpmulld_avx512f(auVar60,auVar44);
              uVar24 = uVar24 + 0x10;
            } while ((uVar22 + 0xf & 0x1fffffff0) != uVar24);
            auVar42 = vmovdqa32_avx512f(auVar43);
            auVar61._0_4_ =
                 (uint)(bVar18 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar44._0_4_;
            bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar61._4_4_ = (uint)bVar13 * auVar42._4_4_ | (uint)!bVar13 * auVar44._4_4_;
            bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar61._8_4_ = (uint)bVar13 * auVar42._8_4_ | (uint)!bVar13 * auVar44._8_4_;
            bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
            auVar61._12_4_ = (uint)bVar13 * auVar42._12_4_ | (uint)!bVar13 * auVar44._12_4_;
            bVar13 = (bool)((byte)(uVar37 >> 4) & 1);
            auVar61._16_4_ = (uint)bVar13 * auVar42._16_4_ | (uint)!bVar13 * auVar44._16_4_;
            bVar13 = (bool)((byte)(uVar37 >> 5) & 1);
            auVar61._20_4_ = (uint)bVar13 * auVar42._20_4_ | (uint)!bVar13 * auVar44._20_4_;
            bVar13 = (bool)((byte)(uVar37 >> 6) & 1);
            auVar61._24_4_ = (uint)bVar13 * auVar42._24_4_ | (uint)!bVar13 * auVar44._24_4_;
            bVar13 = (bool)((byte)(uVar37 >> 7) & 1);
            auVar61._28_4_ = (uint)bVar13 * auVar42._28_4_ | (uint)!bVar13 * auVar44._28_4_;
            auVar61._32_4_ =
                 (uint)(bVar19 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar44._32_4_;
            bVar13 = (bool)(bVar19 >> 1 & 1);
            auVar61._36_4_ = (uint)bVar13 * auVar42._36_4_ | (uint)!bVar13 * auVar44._36_4_;
            bVar13 = (bool)(bVar19 >> 2 & 1);
            auVar61._40_4_ = (uint)bVar13 * auVar42._40_4_ | (uint)!bVar13 * auVar44._40_4_;
            bVar13 = (bool)(bVar19 >> 3 & 1);
            auVar61._44_4_ = (uint)bVar13 * auVar42._44_4_ | (uint)!bVar13 * auVar44._44_4_;
            bVar13 = (bool)(bVar19 >> 4 & 1);
            auVar61._48_4_ = (uint)bVar13 * auVar42._48_4_ | (uint)!bVar13 * auVar44._48_4_;
            bVar13 = (bool)(bVar19 >> 5 & 1);
            auVar61._52_4_ = (uint)bVar13 * auVar42._52_4_ | (uint)!bVar13 * auVar44._52_4_;
            bVar13 = (bool)(bVar19 >> 6 & 1);
            auVar61._56_4_ = (uint)bVar13 * auVar42._56_4_ | (uint)!bVar13 * auVar44._56_4_;
            auVar61._60_4_ =
                 (uint)(bVar19 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar44._60_4_;
            auVar38 = vextracti64x4_avx512f(auVar61,1);
            auVar42 = vpmulld_avx512f(auVar61,ZEXT3264(auVar38));
            auVar14 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
            auVar15 = vpshufd_avx(auVar14,0xee);
            auVar14 = vpmulld_avx(auVar14,auVar15);
            auVar15 = vpshufd_avx(auVar14,0x55);
            auVar14 = vpmulld_avx(auVar14,auVar15);
            iVar76 = auVar14._0_4_;
          }
          lVar21 = *(long *)&(local_1f8->h).
                             super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl +
                   uVar20 * 0x48;
          uVar22 = (ulong)*(uint *)(lVar21 + 0x1c);
          if (uVar22 == 0) {
            iVar78 = 1;
          }
          else {
            auVar42 = vpbroadcastq_avx512f();
            uVar24 = 0;
            auVar43 = vmovdqa64_avx512f(auVar41);
            do {
              auVar44 = vmovdqa64_avx512f(auVar43);
              auVar43 = vpbroadcastq_avx512f();
              auVar45 = vporq_avx512f(auVar43,auVar40);
              auVar43 = vporq_avx512f(auVar43,auVar39);
              uVar17 = vpcmpuq_avx512f(auVar43,auVar42,2);
              bVar18 = (byte)uVar17;
              uVar17 = vpcmpuq_avx512f(auVar45,auVar42,2);
              bVar19 = (byte)uVar17;
              uVar37 = CONCAT11(bVar19,bVar18);
              auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar21 + uVar24 * 4));
              auVar62._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar43._4_4_;
              auVar62._0_4_ = (uint)(bVar18 & 1) * auVar43._0_4_;
              auVar62._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar43._8_4_;
              auVar62._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar43._12_4_;
              auVar62._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar43._16_4_;
              auVar62._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar43._20_4_;
              auVar62._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar43._24_4_;
              auVar62._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar43._28_4_;
              auVar62._32_4_ = (uint)(bVar19 & 1) * auVar43._32_4_;
              auVar62._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar43._36_4_;
              auVar62._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar43._40_4_;
              auVar62._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar43._44_4_;
              auVar62._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar43._48_4_;
              auVar62._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar43._52_4_;
              auVar62._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar43._56_4_;
              auVar62._60_4_ = (uint)(bVar19 >> 7) * auVar43._60_4_;
              auVar43 = vpmulld_avx512f(auVar62,auVar44);
              uVar24 = uVar24 + 0x10;
            } while ((uVar22 + 0xf & 0x1fffffff0) != uVar24);
            auVar42 = vmovdqa32_avx512f(auVar43);
            auVar63._0_4_ =
                 (uint)(bVar18 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar44._0_4_;
            bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar63._4_4_ = (uint)bVar13 * auVar42._4_4_ | (uint)!bVar13 * auVar44._4_4_;
            bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar63._8_4_ = (uint)bVar13 * auVar42._8_4_ | (uint)!bVar13 * auVar44._8_4_;
            bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
            auVar63._12_4_ = (uint)bVar13 * auVar42._12_4_ | (uint)!bVar13 * auVar44._12_4_;
            bVar13 = (bool)((byte)(uVar37 >> 4) & 1);
            auVar63._16_4_ = (uint)bVar13 * auVar42._16_4_ | (uint)!bVar13 * auVar44._16_4_;
            bVar13 = (bool)((byte)(uVar37 >> 5) & 1);
            auVar63._20_4_ = (uint)bVar13 * auVar42._20_4_ | (uint)!bVar13 * auVar44._20_4_;
            bVar13 = (bool)((byte)(uVar37 >> 6) & 1);
            auVar63._24_4_ = (uint)bVar13 * auVar42._24_4_ | (uint)!bVar13 * auVar44._24_4_;
            bVar13 = (bool)((byte)(uVar37 >> 7) & 1);
            auVar63._28_4_ = (uint)bVar13 * auVar42._28_4_ | (uint)!bVar13 * auVar44._28_4_;
            auVar63._32_4_ =
                 (uint)(bVar19 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar44._32_4_;
            bVar13 = (bool)(bVar19 >> 1 & 1);
            auVar63._36_4_ = (uint)bVar13 * auVar42._36_4_ | (uint)!bVar13 * auVar44._36_4_;
            bVar13 = (bool)(bVar19 >> 2 & 1);
            auVar63._40_4_ = (uint)bVar13 * auVar42._40_4_ | (uint)!bVar13 * auVar44._40_4_;
            bVar13 = (bool)(bVar19 >> 3 & 1);
            auVar63._44_4_ = (uint)bVar13 * auVar42._44_4_ | (uint)!bVar13 * auVar44._44_4_;
            bVar13 = (bool)(bVar19 >> 4 & 1);
            auVar63._48_4_ = (uint)bVar13 * auVar42._48_4_ | (uint)!bVar13 * auVar44._48_4_;
            bVar13 = (bool)(bVar19 >> 5 & 1);
            auVar63._52_4_ = (uint)bVar13 * auVar42._52_4_ | (uint)!bVar13 * auVar44._52_4_;
            bVar13 = (bool)(bVar19 >> 6 & 1);
            auVar63._56_4_ = (uint)bVar13 * auVar42._56_4_ | (uint)!bVar13 * auVar44._56_4_;
            auVar63._60_4_ =
                 (uint)(bVar19 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar44._60_4_;
            auVar38 = vextracti64x4_avx512f(auVar63,1);
            auVar42 = vpmulld_avx512f(auVar63,ZEXT3264(auVar38));
            auVar14 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
            auVar15 = vpshufd_avx(auVar14,0xee);
            auVar14 = vpmulld_avx(auVar14,auVar15);
            auVar15 = vpshufd_avx(auVar14,0x55);
            auVar14 = vpmulld_avx(auVar14,auVar15);
            iVar78 = auVar14._0_4_;
          }
          uVar29 = iVar77 * pTVar9[uVar20].d.bd;
          uVar24 = (ulong)uVar29;
          if (iVar78 * *(int *)(lVar21 + 0x20) != uVar29) goto LAB_00255e2c;
          if (uVar22 == 0) {
            iVar77 = 1;
          }
          else {
            auVar42 = vpbroadcastq_avx512f();
            uVar30 = 0;
            auVar43 = vmovdqa64_avx512f(auVar41);
            do {
              auVar44 = vmovdqa64_avx512f(auVar43);
              auVar43 = vpbroadcastq_avx512f();
              auVar45 = vporq_avx512f(auVar43,auVar40);
              auVar43 = vporq_avx512f(auVar43,auVar39);
              uVar17 = vpcmpuq_avx512f(auVar43,auVar42,2);
              bVar18 = (byte)uVar17;
              uVar17 = vpcmpuq_avx512f(auVar45,auVar42,2);
              bVar19 = (byte)uVar17;
              uVar37 = CONCAT11(bVar19,bVar18);
              auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar21 + uVar30 * 4));
              auVar64._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar43._4_4_;
              auVar64._0_4_ = (uint)(bVar18 & 1) * auVar43._0_4_;
              auVar64._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar43._8_4_;
              auVar64._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar43._12_4_;
              auVar64._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar43._16_4_;
              auVar64._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar43._20_4_;
              auVar64._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar43._24_4_;
              auVar64._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar43._28_4_;
              auVar64._32_4_ = (uint)(bVar19 & 1) * auVar43._32_4_;
              auVar64._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar43._36_4_;
              auVar64._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar43._40_4_;
              auVar64._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar43._44_4_;
              auVar64._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar43._48_4_;
              auVar64._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar43._52_4_;
              auVar64._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar43._56_4_;
              auVar64._60_4_ = (uint)(bVar19 >> 7) * auVar43._60_4_;
              auVar43 = vpmulld_avx512f(auVar64,auVar44);
              uVar30 = uVar30 + 0x10;
            } while ((uVar22 + 0xf & 0x1fffffff0) != uVar30);
            auVar42 = vmovdqa32_avx512f(auVar43);
            auVar65._0_4_ =
                 (uint)(bVar18 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar44._0_4_;
            bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar65._4_4_ = (uint)bVar13 * auVar42._4_4_ | (uint)!bVar13 * auVar44._4_4_;
            bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar65._8_4_ = (uint)bVar13 * auVar42._8_4_ | (uint)!bVar13 * auVar44._8_4_;
            bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
            auVar65._12_4_ = (uint)bVar13 * auVar42._12_4_ | (uint)!bVar13 * auVar44._12_4_;
            bVar13 = (bool)((byte)(uVar37 >> 4) & 1);
            auVar65._16_4_ = (uint)bVar13 * auVar42._16_4_ | (uint)!bVar13 * auVar44._16_4_;
            bVar13 = (bool)((byte)(uVar37 >> 5) & 1);
            auVar65._20_4_ = (uint)bVar13 * auVar42._20_4_ | (uint)!bVar13 * auVar44._20_4_;
            bVar13 = (bool)((byte)(uVar37 >> 6) & 1);
            auVar65._24_4_ = (uint)bVar13 * auVar42._24_4_ | (uint)!bVar13 * auVar44._24_4_;
            bVar13 = (bool)((byte)(uVar37 >> 7) & 1);
            auVar65._28_4_ = (uint)bVar13 * auVar42._28_4_ | (uint)!bVar13 * auVar44._28_4_;
            auVar65._32_4_ =
                 (uint)(bVar19 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar44._32_4_;
            bVar13 = (bool)(bVar19 >> 1 & 1);
            auVar65._36_4_ = (uint)bVar13 * auVar42._36_4_ | (uint)!bVar13 * auVar44._36_4_;
            bVar13 = (bool)(bVar19 >> 2 & 1);
            auVar65._40_4_ = (uint)bVar13 * auVar42._40_4_ | (uint)!bVar13 * auVar44._40_4_;
            bVar13 = (bool)(bVar19 >> 3 & 1);
            auVar65._44_4_ = (uint)bVar13 * auVar42._44_4_ | (uint)!bVar13 * auVar44._44_4_;
            bVar13 = (bool)(bVar19 >> 4 & 1);
            auVar65._48_4_ = (uint)bVar13 * auVar42._48_4_ | (uint)!bVar13 * auVar44._48_4_;
            bVar13 = (bool)(bVar19 >> 5 & 1);
            auVar65._52_4_ = (uint)bVar13 * auVar42._52_4_ | (uint)!bVar13 * auVar44._52_4_;
            bVar13 = (bool)(bVar19 >> 6 & 1);
            auVar65._56_4_ = (uint)bVar13 * auVar42._56_4_ | (uint)!bVar13 * auVar44._56_4_;
            auVar65._60_4_ =
                 (uint)(bVar19 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar44._60_4_;
            auVar38 = vextracti64x4_avx512f(auVar65,1);
            auVar42 = vpmulld_avx512f(auVar65,ZEXT3264(auVar38));
            auVar14 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
            auVar15 = vpshufd_avx(auVar14,0xee);
            auVar14 = vpmulld_avx(auVar14,auVar15);
            auVar15 = vpshufd_avx(auVar14,0x55);
            auVar14 = vpmulld_avx(auVar14,auVar15);
            iVar77 = auVar14._0_4_;
          }
          uVar34 = iVar77 * *(int *)(lVar21 + 0x20);
          uVar22 = (ulong)uVar34;
          if (uVar34 != uVar29) goto LAB_00255dba;
          uVar30 = *(ulong *)(lVar21 + 0x28);
          uVar31 = uVar22;
          if (((uVar30 & 3) == 0) &&
             (uVar31 = (ulong)(-((uint)(uVar30 >> 2) & 0x3fffffff) & 0xf), uVar22 <= uVar31)) {
            uVar31 = uVar22;
          }
          lVar11 = *(long *)local_200;
          pfVar6 = pTVar9[uVar20].v;
          eVar12 = (evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                    )pTVar10[uVar20].v;
          local_230 = (ulong)(iVar76 * pTVar10[uVar20].d.bd);
          rVar1 = (pAVar27->super_Trainer).lambda;
          fVar2 = pAVar27->rho;
          fVar16 = 1.0 - fVar2;
          uVar36 = uVar22 - uVar31;
          uVar25 = uVar36 + 0xf;
          if (-1 < (long)uVar36) {
            uVar25 = uVar36;
          }
          if (uVar31 != 0) {
            uVar28 = 0;
            do {
              auVar14 = vfmadd213ss_fma(ZEXT416((uint)(local_278 * pfVar6[uVar28] *
                                                      local_278 * pfVar6[uVar28])),
                                        ZEXT416((uint)fVar16),
                                        ZEXT416((uint)(fVar2 * *(float *)(uVar30 + uVar28 * 4))));
              *(int *)(uVar30 + uVar28 * 4) = auVar14._0_4_;
              uVar28 = uVar28 + 1;
            } while (uVar31 != uVar28);
          }
          uVar25 = (uVar25 & 0xfffffffffffffff0) + uVar31;
          if (0xf < (long)uVar36) {
            auVar42 = vbroadcastss_avx512f(ZEXT416((uint)fVar2));
            auVar43 = vbroadcastss_avx512f(ZEXT416((uint)(fVar16 * local_264)));
            do {
              auVar44 = vmulps_avx512f(auVar42,*(undefined1 (*) [64])(uVar30 + uVar31 * 4));
              auVar45 = vmulps_avx512f(*(undefined1 (*) [64])(pfVar6 + uVar31),
                                       *(undefined1 (*) [64])(pfVar6 + uVar31));
              auVar44 = vfmadd213ps_avx512f(auVar45,auVar43,auVar44);
              *(undefined1 (*) [64])(uVar30 + uVar31 * 4) = auVar44;
              uVar31 = uVar31 + 0x10;
            } while ((long)uVar31 < (long)uVar25);
          }
          if ((long)uVar25 < (long)uVar22) {
            do {
              auVar14 = vfmadd213ss_fma(ZEXT416((uint)(local_278 * pfVar6[uVar25] *
                                                      local_278 * pfVar6[uVar25])),
                                        ZEXT416((uint)fVar16),
                                        ZEXT416((uint)(fVar2 * *(float *)(uVar30 + uVar25 * 4))));
              *(int *)(uVar30 + uVar25 * 4) = auVar14._0_4_;
              uVar25 = uVar25 + 1;
            } while (uVar22 != uVar25);
          }
          pLVar26 = *(LookupParameters **)(lVar11 + (uVar20 * 9 + 5) * 8);
          uVar22 = (ulong)*(uint *)(lVar11 + (uVar20 * 9 + 3) * 8 + 4);
          if (uVar22 == 0) {
            iVar76 = 1;
          }
          else {
            auVar42 = vpbroadcastq_avx512f();
            uVar30 = 0;
            auVar43 = vmovdqa64_avx512f(auVar41);
            do {
              auVar44 = vmovdqa64_avx512f(auVar43);
              auVar43 = vpbroadcastq_avx512f();
              auVar45 = vporq_avx512f(auVar43,auVar40);
              auVar43 = vporq_avx512f(auVar43,auVar39);
              uVar17 = vpcmpuq_avx512f(auVar43,auVar42,2);
              bVar18 = (byte)uVar17;
              uVar17 = vpcmpuq_avx512f(auVar45,auVar42,2);
              bVar19 = (byte)uVar17;
              uVar37 = CONCAT11(bVar19,bVar18);
              auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                           (lVar11 + uVar20 * 0x48 + uVar30 * 4));
              auVar66._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar43._4_4_;
              auVar66._0_4_ = (uint)(bVar18 & 1) * auVar43._0_4_;
              auVar66._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar43._8_4_;
              auVar66._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar43._12_4_;
              auVar66._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar43._16_4_;
              auVar66._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar43._20_4_;
              auVar66._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar43._24_4_;
              auVar66._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar43._28_4_;
              auVar66._32_4_ = (uint)(bVar19 & 1) * auVar43._32_4_;
              auVar66._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar43._36_4_;
              auVar66._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar43._40_4_;
              auVar66._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar43._44_4_;
              auVar66._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar43._48_4_;
              auVar66._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar43._52_4_;
              auVar66._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar43._56_4_;
              auVar66._60_4_ = (uint)(bVar19 >> 7) * auVar43._60_4_;
              auVar43 = vpmulld_avx512f(auVar66,auVar44);
              uVar30 = uVar30 + 0x10;
            } while ((uVar22 + 0xf & 0x1fffffff0) != uVar30);
            auVar42 = vmovdqa32_avx512f(auVar43);
            auVar67._0_4_ =
                 (uint)(bVar18 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar44._0_4_;
            bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar67._4_4_ = (uint)bVar13 * auVar42._4_4_ | (uint)!bVar13 * auVar44._4_4_;
            bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar67._8_4_ = (uint)bVar13 * auVar42._8_4_ | (uint)!bVar13 * auVar44._8_4_;
            bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
            auVar67._12_4_ = (uint)bVar13 * auVar42._12_4_ | (uint)!bVar13 * auVar44._12_4_;
            bVar13 = (bool)((byte)(uVar37 >> 4) & 1);
            auVar67._16_4_ = (uint)bVar13 * auVar42._16_4_ | (uint)!bVar13 * auVar44._16_4_;
            bVar13 = (bool)((byte)(uVar37 >> 5) & 1);
            auVar67._20_4_ = (uint)bVar13 * auVar42._20_4_ | (uint)!bVar13 * auVar44._20_4_;
            bVar13 = (bool)((byte)(uVar37 >> 6) & 1);
            auVar67._24_4_ = (uint)bVar13 * auVar42._24_4_ | (uint)!bVar13 * auVar44._24_4_;
            bVar13 = (bool)((byte)(uVar37 >> 7) & 1);
            auVar67._28_4_ = (uint)bVar13 * auVar42._28_4_ | (uint)!bVar13 * auVar44._28_4_;
            auVar67._32_4_ =
                 (uint)(bVar19 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar44._32_4_;
            bVar13 = (bool)(bVar19 >> 1 & 1);
            auVar67._36_4_ = (uint)bVar13 * auVar42._36_4_ | (uint)!bVar13 * auVar44._36_4_;
            bVar13 = (bool)(bVar19 >> 2 & 1);
            auVar67._40_4_ = (uint)bVar13 * auVar42._40_4_ | (uint)!bVar13 * auVar44._40_4_;
            bVar13 = (bool)(bVar19 >> 3 & 1);
            auVar67._44_4_ = (uint)bVar13 * auVar42._44_4_ | (uint)!bVar13 * auVar44._44_4_;
            bVar13 = (bool)(bVar19 >> 4 & 1);
            auVar67._48_4_ = (uint)bVar13 * auVar42._48_4_ | (uint)!bVar13 * auVar44._48_4_;
            bVar13 = (bool)(bVar19 >> 5 & 1);
            auVar67._52_4_ = (uint)bVar13 * auVar42._52_4_ | (uint)!bVar13 * auVar44._52_4_;
            bVar13 = (bool)(bVar19 >> 6 & 1);
            auVar67._56_4_ = (uint)bVar13 * auVar42._56_4_ | (uint)!bVar13 * auVar44._56_4_;
            auVar67._60_4_ =
                 (uint)(bVar19 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar44._60_4_;
            auVar38 = vextracti64x4_avx512f(auVar67,1);
            auVar42 = vpmulld_avx512f(auVar67,ZEXT3264(auVar38));
            auVar14 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
            auVar15 = vpshufd_avx(auVar14,0xee);
            auVar14 = vpmulld_avx(auVar14,auVar15);
            auVar15 = vpshufd_avx(auVar14,0x55);
            auVar14 = vpmulld_avx(auVar14,auVar15);
            iVar76 = auVar14._0_4_;
          }
          iVar77 = *(int *)(lVar11 + (uVar20 * 9 + 4) * 8);
          uVar34 = iVar76 * iVar77;
          uVar30 = (ulong)uVar34;
          local_238 = pPVar4;
          if (uVar29 != uVar34) goto LAB_00255dfe;
          if ((ulong)*(uint *)(lVar21 + 0x1c) == 0) {
            iVar76 = 1;
          }
          else {
            auVar42 = vpbroadcastq_avx512f();
            uVar31 = 0;
            auVar43 = vmovdqa64_avx512f(auVar41);
            do {
              auVar44 = vmovdqa64_avx512f(auVar43);
              auVar43 = vpbroadcastq_avx512f();
              auVar45 = vporq_avx512f(auVar43,auVar40);
              auVar43 = vporq_avx512f(auVar43,auVar39);
              uVar17 = vpcmpuq_avx512f(auVar43,auVar42,2);
              bVar18 = (byte)uVar17;
              uVar17 = vpcmpuq_avx512f(auVar45,auVar42,2);
              bVar19 = (byte)uVar17;
              uVar37 = CONCAT11(bVar19,bVar18);
              auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar21 + uVar31 * 4));
              auVar68._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar43._4_4_;
              auVar68._0_4_ = (uint)(bVar18 & 1) * auVar43._0_4_;
              auVar68._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar43._8_4_;
              auVar68._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar43._12_4_;
              auVar68._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar43._16_4_;
              auVar68._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar43._20_4_;
              auVar68._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar43._24_4_;
              auVar68._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar43._28_4_;
              auVar68._32_4_ = (uint)(bVar19 & 1) * auVar43._32_4_;
              auVar68._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar43._36_4_;
              auVar68._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar43._40_4_;
              auVar68._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar43._44_4_;
              auVar68._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar43._48_4_;
              auVar68._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar43._52_4_;
              auVar68._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar43._56_4_;
              auVar68._60_4_ = (uint)(bVar19 >> 7) * auVar43._60_4_;
              auVar43 = vpmulld_avx512f(auVar68,auVar44);
              uVar31 = uVar31 + 0x10;
            } while (((ulong)*(uint *)(lVar21 + 0x1c) + 0xf & 0x1fffffff0) != uVar31);
            auVar42 = vmovdqa32_avx512f(auVar43);
            auVar69._0_4_ =
                 (uint)(bVar18 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar44._0_4_;
            bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar69._4_4_ = (uint)bVar13 * auVar42._4_4_ | (uint)!bVar13 * auVar44._4_4_;
            bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar69._8_4_ = (uint)bVar13 * auVar42._8_4_ | (uint)!bVar13 * auVar44._8_4_;
            bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
            auVar69._12_4_ = (uint)bVar13 * auVar42._12_4_ | (uint)!bVar13 * auVar44._12_4_;
            bVar13 = (bool)((byte)(uVar37 >> 4) & 1);
            auVar69._16_4_ = (uint)bVar13 * auVar42._16_4_ | (uint)!bVar13 * auVar44._16_4_;
            bVar13 = (bool)((byte)(uVar37 >> 5) & 1);
            auVar69._20_4_ = (uint)bVar13 * auVar42._20_4_ | (uint)!bVar13 * auVar44._20_4_;
            bVar13 = (bool)((byte)(uVar37 >> 6) & 1);
            auVar69._24_4_ = (uint)bVar13 * auVar42._24_4_ | (uint)!bVar13 * auVar44._24_4_;
            bVar13 = (bool)((byte)(uVar37 >> 7) & 1);
            auVar69._28_4_ = (uint)bVar13 * auVar42._28_4_ | (uint)!bVar13 * auVar44._28_4_;
            auVar69._32_4_ =
                 (uint)(bVar19 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar44._32_4_;
            bVar13 = (bool)(bVar19 >> 1 & 1);
            auVar69._36_4_ = (uint)bVar13 * auVar42._36_4_ | (uint)!bVar13 * auVar44._36_4_;
            bVar13 = (bool)(bVar19 >> 2 & 1);
            auVar69._40_4_ = (uint)bVar13 * auVar42._40_4_ | (uint)!bVar13 * auVar44._40_4_;
            bVar13 = (bool)(bVar19 >> 3 & 1);
            auVar69._44_4_ = (uint)bVar13 * auVar42._44_4_ | (uint)!bVar13 * auVar44._44_4_;
            bVar13 = (bool)(bVar19 >> 4 & 1);
            auVar69._48_4_ = (uint)bVar13 * auVar42._48_4_ | (uint)!bVar13 * auVar44._48_4_;
            bVar13 = (bool)(bVar19 >> 5 & 1);
            auVar69._52_4_ = (uint)bVar13 * auVar42._52_4_ | (uint)!bVar13 * auVar44._52_4_;
            bVar13 = (bool)(bVar19 >> 6 & 1);
            auVar69._56_4_ = (uint)bVar13 * auVar42._56_4_ | (uint)!bVar13 * auVar44._56_4_;
            auVar69._60_4_ =
                 (uint)(bVar19 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar44._60_4_;
            auVar38 = vextracti64x4_avx512f(auVar69,1);
            auVar42 = vpmulld_avx512f(auVar69,ZEXT3264(auVar38));
            auVar14 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
            auVar15 = vpshufd_avx(auVar14,0xee);
            auVar14 = vpmulld_avx(auVar14,auVar15);
            auVar15 = vpshufd_avx(auVar14,0x55);
            auVar14 = vpmulld_avx(auVar14,auVar15);
            iVar76 = auVar14._0_4_;
          }
          uVar29 = iVar76 * *(int *)(lVar21 + 0x20);
          pLVar35 = (LookupParameters *)(ulong)uVar29;
          local_210 = eVar33;
          local_208 = eVar12;
          if (uVar34 - uVar29 != 0) goto LAB_00255e5a;
          if (uVar22 == 0) {
            iVar76 = 1;
          }
          else {
            auVar42 = vpbroadcastq_avx512f();
            uVar31 = 0;
            auVar43 = vmovdqa64_avx512f(auVar41);
            do {
              auVar44 = vmovdqa64_avx512f(auVar43);
              auVar43 = vpbroadcastq_avx512f();
              auVar45 = vporq_avx512f(auVar43,auVar40);
              auVar43 = vporq_avx512f(auVar43,auVar39);
              uVar17 = vpcmpuq_avx512f(auVar43,auVar42,2);
              bVar18 = (byte)uVar17;
              uVar17 = vpcmpuq_avx512f(auVar45,auVar42,2);
              bVar19 = (byte)uVar17;
              uVar37 = CONCAT11(bVar19,bVar18);
              auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                           (lVar11 + uVar20 * 0x48 + uVar31 * 4));
              auVar70._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar43._4_4_;
              auVar70._0_4_ = (uint)(bVar18 & 1) * auVar43._0_4_;
              auVar70._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar43._8_4_;
              auVar70._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar43._12_4_;
              auVar70._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar43._16_4_;
              auVar70._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar43._20_4_;
              auVar70._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar43._24_4_;
              auVar70._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar43._28_4_;
              auVar70._32_4_ = (uint)(bVar19 & 1) * auVar43._32_4_;
              auVar70._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar43._36_4_;
              auVar70._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar43._40_4_;
              auVar70._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar43._44_4_;
              auVar70._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar43._48_4_;
              auVar70._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar43._52_4_;
              auVar70._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar43._56_4_;
              auVar70._60_4_ = (uint)(bVar19 >> 7) * auVar43._60_4_;
              auVar43 = vpmulld_avx512f(auVar70,auVar44);
              uVar31 = uVar31 + 0x10;
            } while ((uVar22 + 0xf & 0x1fffffff0) != uVar31);
            auVar42 = vmovdqa32_avx512f(auVar43);
            auVar71._0_4_ =
                 (uint)(bVar18 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar44._0_4_;
            bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar71._4_4_ = (uint)bVar13 * auVar42._4_4_ | (uint)!bVar13 * auVar44._4_4_;
            bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar71._8_4_ = (uint)bVar13 * auVar42._8_4_ | (uint)!bVar13 * auVar44._8_4_;
            bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
            auVar71._12_4_ = (uint)bVar13 * auVar42._12_4_ | (uint)!bVar13 * auVar44._12_4_;
            bVar13 = (bool)((byte)(uVar37 >> 4) & 1);
            auVar71._16_4_ = (uint)bVar13 * auVar42._16_4_ | (uint)!bVar13 * auVar44._16_4_;
            bVar13 = (bool)((byte)(uVar37 >> 5) & 1);
            auVar71._20_4_ = (uint)bVar13 * auVar42._20_4_ | (uint)!bVar13 * auVar44._20_4_;
            bVar13 = (bool)((byte)(uVar37 >> 6) & 1);
            auVar71._24_4_ = (uint)bVar13 * auVar42._24_4_ | (uint)!bVar13 * auVar44._24_4_;
            bVar13 = (bool)((byte)(uVar37 >> 7) & 1);
            auVar71._28_4_ = (uint)bVar13 * auVar42._28_4_ | (uint)!bVar13 * auVar44._28_4_;
            auVar71._32_4_ =
                 (uint)(bVar19 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar44._32_4_;
            bVar13 = (bool)(bVar19 >> 1 & 1);
            auVar71._36_4_ = (uint)bVar13 * auVar42._36_4_ | (uint)!bVar13 * auVar44._36_4_;
            bVar13 = (bool)(bVar19 >> 2 & 1);
            auVar71._40_4_ = (uint)bVar13 * auVar42._40_4_ | (uint)!bVar13 * auVar44._40_4_;
            bVar13 = (bool)(bVar19 >> 3 & 1);
            auVar71._44_4_ = (uint)bVar13 * auVar42._44_4_ | (uint)!bVar13 * auVar44._44_4_;
            bVar13 = (bool)(bVar19 >> 4 & 1);
            auVar71._48_4_ = (uint)bVar13 * auVar42._48_4_ | (uint)!bVar13 * auVar44._48_4_;
            bVar13 = (bool)(bVar19 >> 5 & 1);
            auVar71._52_4_ = (uint)bVar13 * auVar42._52_4_ | (uint)!bVar13 * auVar44._52_4_;
            bVar13 = (bool)(bVar19 >> 6 & 1);
            auVar71._56_4_ = (uint)bVar13 * auVar42._56_4_ | (uint)!bVar13 * auVar44._56_4_;
            auVar71._60_4_ =
                 (uint)(bVar19 >> 7) * auVar42._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar44._60_4_;
            auVar38 = vextracti64x4_avx512f(auVar71,1);
            auVar42 = vpmulld_avx512f(auVar71,ZEXT3264(auVar38));
            auVar14 = vpmulld_avx(auVar42._0_16_,auVar42._16_16_);
            auVar15 = vpshufd_avx(auVar14,0xee);
            auVar14 = vpmulld_avx(auVar14,auVar15);
            auVar15 = vpshufd_avx(auVar14,0x55);
            auVar14 = vpmulld_avx(auVar14,auVar15);
            iVar76 = auVar14._0_4_;
          }
          uVar34 = iVar76 * iVar77;
          if (uVar34 != uVar29) goto LAB_00255e15;
          uVar22 = (ulong)*(uint *)(lVar11 + (uVar20 * 9 + 3) * 8 + 4);
          if (uVar22 == 0) {
            iVar76 = 1;
          }
          else {
            auVar42 = vpbroadcastq_avx512f();
            uVar31 = 0;
            auVar41 = vmovdqa64_avx512f(auVar41);
            do {
              auVar43 = vmovdqa64_avx512f(auVar41);
              auVar41 = vpbroadcastq_avx512f();
              auVar44 = vporq_avx512f(auVar41,auVar40);
              auVar41 = vporq_avx512f(auVar41,auVar39);
              uVar17 = vpcmpuq_avx512f(auVar41,auVar42,2);
              bVar18 = (byte)uVar17;
              uVar17 = vpcmpuq_avx512f(auVar44,auVar42,2);
              bVar19 = (byte)uVar17;
              uVar37 = CONCAT11(bVar19,bVar18);
              auVar41 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                           (lVar11 + uVar20 * 0x48 + uVar31 * 4));
              auVar72._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar41._4_4_;
              auVar72._0_4_ = (uint)(bVar18 & 1) * auVar41._0_4_;
              auVar72._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar41._8_4_;
              auVar72._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar41._12_4_;
              auVar72._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar41._16_4_;
              auVar72._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar41._20_4_;
              auVar72._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar41._24_4_;
              auVar72._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar41._28_4_;
              auVar72._32_4_ = (uint)(bVar19 & 1) * auVar41._32_4_;
              auVar72._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar41._36_4_;
              auVar72._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar41._40_4_;
              auVar72._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar41._44_4_;
              auVar72._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar41._48_4_;
              auVar72._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar41._52_4_;
              auVar72._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar41._56_4_;
              auVar72._60_4_ = (uint)(bVar19 >> 7) * auVar41._60_4_;
              auVar41 = vpmulld_avx512f(auVar72,auVar43);
              uVar31 = uVar31 + 0x10;
            } while ((uVar22 + 0xf & 0x1fffffff0) != uVar31);
            auVar39 = vmovdqa32_avx512f(auVar41);
            auVar73._0_4_ =
                 (uint)(bVar18 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar43._0_4_;
            bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar73._4_4_ = (uint)bVar13 * auVar39._4_4_ | (uint)!bVar13 * auVar43._4_4_;
            bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar73._8_4_ = (uint)bVar13 * auVar39._8_4_ | (uint)!bVar13 * auVar43._8_4_;
            bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
            auVar73._12_4_ = (uint)bVar13 * auVar39._12_4_ | (uint)!bVar13 * auVar43._12_4_;
            bVar13 = (bool)((byte)(uVar37 >> 4) & 1);
            auVar73._16_4_ = (uint)bVar13 * auVar39._16_4_ | (uint)!bVar13 * auVar43._16_4_;
            bVar13 = (bool)((byte)(uVar37 >> 5) & 1);
            auVar73._20_4_ = (uint)bVar13 * auVar39._20_4_ | (uint)!bVar13 * auVar43._20_4_;
            bVar13 = (bool)((byte)(uVar37 >> 6) & 1);
            auVar73._24_4_ = (uint)bVar13 * auVar39._24_4_ | (uint)!bVar13 * auVar43._24_4_;
            bVar13 = (bool)((byte)(uVar37 >> 7) & 1);
            auVar73._28_4_ = (uint)bVar13 * auVar39._28_4_ | (uint)!bVar13 * auVar43._28_4_;
            auVar73._32_4_ =
                 (uint)(bVar19 & 1) * auVar39._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar43._32_4_;
            bVar13 = (bool)(bVar19 >> 1 & 1);
            auVar73._36_4_ = (uint)bVar13 * auVar39._36_4_ | (uint)!bVar13 * auVar43._36_4_;
            bVar13 = (bool)(bVar19 >> 2 & 1);
            auVar73._40_4_ = (uint)bVar13 * auVar39._40_4_ | (uint)!bVar13 * auVar43._40_4_;
            bVar13 = (bool)(bVar19 >> 3 & 1);
            auVar73._44_4_ = (uint)bVar13 * auVar39._44_4_ | (uint)!bVar13 * auVar43._44_4_;
            bVar13 = (bool)(bVar19 >> 4 & 1);
            auVar73._48_4_ = (uint)bVar13 * auVar39._48_4_ | (uint)!bVar13 * auVar43._48_4_;
            bVar13 = (bool)(bVar19 >> 5 & 1);
            auVar73._52_4_ = (uint)bVar13 * auVar39._52_4_ | (uint)!bVar13 * auVar43._52_4_;
            bVar13 = (bool)(bVar19 >> 6 & 1);
            auVar73._56_4_ = (uint)bVar13 * auVar39._56_4_ | (uint)!bVar13 * auVar43._56_4_;
            auVar73._60_4_ =
                 (uint)(bVar19 >> 7) * auVar39._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar43._60_4_;
            auVar38 = vextracti64x4_avx512f(auVar73,1);
            auVar39 = vpmulld_avx512f(auVar73,ZEXT3264(auVar38));
            auVar14 = vpmulld_avx(auVar39._0_16_,auVar39._16_16_);
            auVar15 = vpshufd_avx(auVar14,0xee);
            auVar14 = vpmulld_avx(auVar14,auVar15);
            auVar15 = vpshufd_avx(auVar14,0x55);
            auVar14 = vpmulld_avx(auVar14,auVar15);
            iVar76 = auVar14._0_4_;
          }
          local_d8.m_other = pAVar27->epsilon;
          pfVar7 = *(float **)(lVar21 + 0x28);
          local_1f0 = *(float **)(lVar11 + (uVar20 * 9 + 5) * 8);
          uVar32 = iVar76 * *(int *)(lVar11 + (uVar20 * 9 + 4) * 8);
          local_1e8 = (ulong)uVar32;
          stack0xfffffffffffffe50 = (pointer)CONCAT44(pAVar27->rho,local_1b8._8_4_);
          local_188 = (float *)CONCAT44(1.0 - pAVar27->rho,(undefined4)local_188);
          local_154.m_other = local_278;
          local_108.m_functor.m_other = local_d8.m_other;
          local_b4.m_other = local_278;
          local_1a0 = pLVar26;
          local_190.m_value = (ulong)uVar34;
          local_148 = pfVar6;
          local_138.m_value = uVar24;
          local_120 = pLVar26;
          local_110.m_value = uVar30;
          local_f0 = pfVar7;
          local_e0.m_value = (long)pLVar35;
          local_a8 = pfVar6;
          local_98.m_value = uVar24;
          local_80 = pLVar26;
          local_70.m_value = uVar30;
          local_68.m_other = local_d8.m_other;
          local_50 = pfVar7;
          local_40.m_value = (long)pLVar35;
          local_38.m_other = local_d8.m_other;
          if (uVar32 != uVar29) goto LAB_00255dba;
          local_218 = CONCAT44(local_218._4_4_,rVar1);
          local_258.m_dst = (DstEvaluatorType *)local_1d8;
          local_258.m_src = (SrcEvaluatorType *)local_1b8;
          local_258.m_functor = &local_279;
          local_258.m_dstExpr = (DstXprType *)&local_1f0;
          local_274 = local_d8.m_other;
          local_1d8[0] = local_1f0;
          local_1c8 = local_1e8;
          Eigen::internal::dense_assignment_loop<$6ae401cf$>::run(&local_258);
          if (uVar29 - (uint)local_230 != 0) goto LAB_00255e43;
          pTVar9 = (local_270->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar20 = (ulong)(pTVar9->d).d[(long)((Dim *)&local_238->super_ParametersBase)->d * 2U + 7]
          ;
          if (uVar20 == 0) {
            iVar76 = 1;
          }
          else {
            auVar39 = vpbroadcastq_avx512f();
            uVar22 = 0;
            auVar40 = vpbroadcastd_avx512f(ZEXT416(1));
            auVar41 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar42 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            do {
              auVar43 = vmovdqa64_avx512f(auVar40);
              auVar40 = vpbroadcastq_avx512f();
              auVar44 = vporq_avx512f(auVar40,auVar41);
              auVar40 = vporq_avx512f(auVar40,auVar42);
              uVar17 = vpcmpuq_avx512f(auVar40,auVar39,2);
              bVar18 = (byte)uVar17;
              uVar17 = vpcmpuq_avx512f(auVar44,auVar39,2);
              bVar19 = (byte)uVar17;
              uVar37 = CONCAT11(bVar19,bVar18);
              auVar40 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                           ((pTVar9->d).d + (long)local_238 * 2U + uVar22));
              auVar74._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar40._4_4_;
              auVar74._0_4_ = (uint)(bVar18 & 1) * auVar40._0_4_;
              auVar74._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar40._8_4_;
              auVar74._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar40._12_4_;
              auVar74._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar40._16_4_;
              auVar74._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar40._20_4_;
              auVar74._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar40._24_4_;
              auVar74._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar40._28_4_;
              auVar74._32_4_ = (uint)(bVar19 & 1) * auVar40._32_4_;
              auVar74._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar40._36_4_;
              auVar74._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar40._40_4_;
              auVar74._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar40._44_4_;
              auVar74._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar40._48_4_;
              auVar74._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar40._52_4_;
              auVar74._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar40._56_4_;
              auVar74._60_4_ = (uint)(bVar19 >> 7) * auVar40._60_4_;
              auVar40 = vpmulld_avx512f(auVar74,auVar43);
              uVar22 = uVar22 + 0x10;
            } while ((uVar20 + 0xf & 0x1fffffff0) != uVar22);
            auVar39 = vmovdqa32_avx512f(auVar40);
            auVar75._0_4_ =
                 (uint)(bVar18 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar43._0_4_;
            bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar75._4_4_ = (uint)bVar13 * auVar39._4_4_ | (uint)!bVar13 * auVar43._4_4_;
            bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar75._8_4_ = (uint)bVar13 * auVar39._8_4_ | (uint)!bVar13 * auVar43._8_4_;
            bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
            auVar75._12_4_ = (uint)bVar13 * auVar39._12_4_ | (uint)!bVar13 * auVar43._12_4_;
            bVar13 = (bool)((byte)(uVar37 >> 4) & 1);
            auVar75._16_4_ = (uint)bVar13 * auVar39._16_4_ | (uint)!bVar13 * auVar43._16_4_;
            bVar13 = (bool)((byte)(uVar37 >> 5) & 1);
            auVar75._20_4_ = (uint)bVar13 * auVar39._20_4_ | (uint)!bVar13 * auVar43._20_4_;
            bVar13 = (bool)((byte)(uVar37 >> 6) & 1);
            auVar75._24_4_ = (uint)bVar13 * auVar39._24_4_ | (uint)!bVar13 * auVar43._24_4_;
            bVar13 = (bool)((byte)(uVar37 >> 7) & 1);
            auVar75._28_4_ = (uint)bVar13 * auVar39._28_4_ | (uint)!bVar13 * auVar43._28_4_;
            auVar75._32_4_ =
                 (uint)(bVar19 & 1) * auVar39._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar43._32_4_;
            bVar13 = (bool)(bVar19 >> 1 & 1);
            auVar75._36_4_ = (uint)bVar13 * auVar39._36_4_ | (uint)!bVar13 * auVar43._36_4_;
            bVar13 = (bool)(bVar19 >> 2 & 1);
            auVar75._40_4_ = (uint)bVar13 * auVar39._40_4_ | (uint)!bVar13 * auVar43._40_4_;
            bVar13 = (bool)(bVar19 >> 3 & 1);
            auVar75._44_4_ = (uint)bVar13 * auVar39._44_4_ | (uint)!bVar13 * auVar43._44_4_;
            bVar13 = (bool)(bVar19 >> 4 & 1);
            auVar75._48_4_ = (uint)bVar13 * auVar39._48_4_ | (uint)!bVar13 * auVar43._48_4_;
            bVar13 = (bool)(bVar19 >> 5 & 1);
            auVar75._52_4_ = (uint)bVar13 * auVar39._52_4_ | (uint)!bVar13 * auVar43._52_4_;
            bVar13 = (bool)(bVar19 >> 6 & 1);
            auVar75._56_4_ = (uint)bVar13 * auVar39._56_4_ | (uint)!bVar13 * auVar43._56_4_;
            auVar75._60_4_ =
                 (uint)(bVar19 >> 7) * auVar39._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar43._60_4_;
            auVar38 = vextracti64x4_avx512f(auVar75,1);
            auVar39 = vpmulld_avx512f(auVar75,ZEXT3264(auVar38));
            auVar14 = vpmulld_avx(auVar39._0_16_,auVar39._16_16_);
            auVar15 = vpshufd_avx(auVar14,0xee);
            auVar14 = vpmulld_avx(auVar14,auVar15);
            auVar15 = vpshufd_avx(auVar14,0x55);
            auVar14 = vpmulld_avx(auVar14,auVar15);
            iVar76 = auVar14._0_4_;
          }
          local_1f0 = *(float **)
                       ((long)(&pTVar9->d + 1) +
                       (long)((Dim *)&local_238->super_ParametersBase)->d * 8 + 4);
          uVar29 = iVar76 * (pTVar9->d).d
                            [(long)((Dim *)&local_238->super_ParametersBase)->d * 2U + 8];
          local_1e8 = (ulong)uVar29;
          local_194 = local_278;
          local_148 = (float *)CONCAT44(local_148._4_4_,local_274);
          local_118 = local_274;
          local_108 = local_208;
          local_f8 = local_230;
          local_f0 = (float *)CONCAT44(local_f0._4_4_,(undefined4)local_218);
          local_188 = pfVar6;
          local_178 = uVar24;
          local_160 = pLVar26;
          local_150 = uVar30;
          local_130 = pfVar7;
          local_120 = pLVar35;
          if (uVar29 != (uint)local_230) goto LAB_00255ddc;
          local_258.m_dst = (DstEvaluatorType *)local_1d8;
          local_258.m_src = (SrcEvaluatorType *)local_1b8;
          local_258.m_functor = &local_279;
          local_258.m_dstExpr = (DstXprType *)&local_1f0;
          local_1d8[0] = local_1f0;
          local_1c8 = local_1e8;
          Eigen::internal::
          dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,_-1,_1,_0,_-1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,_-1,_1,_0,_-1,_1>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>_>_>,_Eigen::internal::add_assign_op<float,_float>,_0>,_3,_0>
          ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>,_Eigen::internal::add_assign_op<float,_float>,_0>
                 *)&local_258);
          auVar39 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar40 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar41 = vpbroadcastd_avx512f(ZEXT416(1));
          eVar33 = *(evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                     *)local_210;
          pAVar27 = local_220;
        } while (eVar33 != (evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                            )0x0);
      }
      LookupParameters::clear(local_270);
      auVar39 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar40 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar41 = vpbroadcastd_avx512f(ZEXT416(1));
      local_260 = (ulong)((int)local_260 + 1);
      puVar23 = local_228 + 1;
    } while (puVar23 != local_1c0);
  }
  (pAVar27->super_Trainer).updates = (pAVar27->super_Trainer).updates + 1.0;
  return;
LAB_00255e2c:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>>]"
  ;
  goto LAB_00255e6f;
LAB_00255dfe:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>]"
  ;
  goto LAB_00255e6f;
LAB_00255e5a:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<float>, Lhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::Cwi..." /* TRUNCATED STRING LITERAL */
  ;
  goto LAB_00255e6f;
LAB_00255e15:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen..." /* TRUNCATED STRING LITERAL */
  ;
  goto LAB_00255e6f;
LAB_00255e43:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::Ma..." /* TRUNCATED STRING LITERAL */
  ;
LAB_00255e6f:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,__function);
}

Assistant:

void AdadeltaTrainer::update(real scale) {
  unsigned pi;
  if (!shadow_params_allocated) {
    hg = AllocateShadowParameters(*model);
    hlg = AllocateShadowLookupParameters(*model);
    hd = AllocateShadowParameters(*model);
    hld = AllocateShadowLookupParameters(*model);

    /*pi = 0;
    for (auto p : model->parameters_list()) {
      TensorTools::Constant(hg[pi].h, epsilon);
      TensorTools::Constant(hd[pi].h, epsilon);
      ++pi;
    }

    pi = 0;
    for (auto p : model->lookup_parameters_list()) {
      vector<Tensor>& hgx = hlg[pi].h;
      vector<Tensor>& hdx = hld[pi].h;
      for (unsigned i = 0; i < hgx.size(); ++i) {
        TensorTools::Constant(hgx[i], epsilon);
        TensorTools::Constant(hdx[i], epsilon);
      }
      ++pi;
    }*/

    shadow_params_allocated = true;
  }

  const float gscale = clip_gradients();
  pi = 0;
  for (auto p : model->parameters_list()) {
    auto& g = (scale * gscale) * p->g.vec();
    Tensor& hgv = hg[pi].h;
    Tensor& hdv = hd[pi].h;
    auto reg = p->values.vec() * lambda;
    auto g2 = g.cwiseProduct(g);
    hgv.vec() = rho * hgv.vec() + (1.0 - rho) * g2;
    auto num = -g.cwiseProduct((hdv.vec().array() + epsilon).matrix().cwiseSqrt());
    auto den = (hgv.vec().array() + epsilon).matrix().cwiseSqrt();
    auto delta = num.cwiseQuotient(den);
    auto d2 = delta.cwiseProduct(delta);
    hdv.vec() = rho * hdv.vec() + (1.0 - rho) * d2;
    p->values.vec() += delta - reg;
    p->clear();
    pi++;
  }

  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<Tensor>& hgvx = hlg[pi].h;
    vector<Tensor>& hdvx = hld[pi].h;
    for (auto i : p->non_zero_grads) {
      Tensor& hgv = hgvx[i];
      Tensor& hdv = hdvx[i];
      auto& g = scale * gscale * p->grads[i].vec();
      auto reg = p->values[i].vec() * lambda;
      auto g2 = g.cwiseProduct(g);
      hgv.vec() = rho * hgv.vec() + (1.0 - rho) * g2;
      auto num = -g.cwiseProduct((hdv.vec().array() + epsilon).matrix().cwiseSqrt());
      auto den = (hgv.vec().array() + epsilon).matrix().cwiseSqrt();
      auto delta = num.cwiseQuotient(den);
      auto d2 = delta.cwiseProduct(delta);
      hdv.vec() = rho * hdv.vec() + (1.0 - rho) * d2;
      p->values[i].vec() += delta - reg;
    }
    p->clear();
    pi++;
  }
  ++updates;
}